

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx::CurveNiIntersectorK<4,4>::
     intersect_hn<embree::avx::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  Primitive PVar6;
  Geometry *pGVar7;
  long lVar8;
  __int_type_conflict _Var9;
  RTCFilterFunctionN p_Var10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  bool bVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  uint uVar55;
  uint uVar56;
  uint uVar57;
  ulong uVar58;
  long lVar59;
  uint uVar60;
  ulong uVar61;
  float fVar63;
  float fVar75;
  vint4 bi_2;
  undefined1 auVar65 [16];
  float fVar64;
  float fVar76;
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar67 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 extraout_var [56];
  vint4 bi_1;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  vint4 ai;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar114;
  float fVar131;
  float fVar132;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar133;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  vint4 bi;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  float fVar149;
  float fVar168;
  float fVar169;
  vint4 ai_2;
  undefined1 auVar150 [16];
  float fVar170;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar171;
  float fVar184;
  float fVar185;
  undefined1 auVar172 [16];
  float fVar186;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar177 [16];
  undefined1 auVar183 [32];
  vfloat4 b0;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  float fVar200;
  float fVar215;
  float fVar216;
  vint4 ai_1;
  undefined1 auVar201 [16];
  float fVar217;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  float fVar234;
  float fVar243;
  float fVar244;
  vfloat4 a0_1;
  float fVar245;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [32];
  float fVar246;
  float fVar253;
  float fVar254;
  __m128 a;
  float fVar255;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar256;
  float fVar261;
  float fVar262;
  undefined1 auVar257 [16];
  float fVar263;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar264;
  float fVar265;
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  float fVar278;
  float fVar279;
  undefined1 auVar272 [16];
  float fVar280;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  float fVar281;
  float fVar282;
  undefined1 auVar277 [32];
  float fVar283;
  float fVar284;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  vfloat4 a0;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar298 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_5d8 [8];
  float fStack_5d0;
  float fStack_5cc;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  undefined1 local_578 [8];
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  float fStack_560;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  undefined1 local_538 [16];
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 *local_440;
  ulong local_438;
  long local_430;
  RTCFilterFunctionNArguments local_428;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  uint auStack_368 [4];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [32];
  float afStack_208 [8];
  RTCHitN local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar62;
  undefined1 auVar130 [32];
  undefined1 auVar297 [32];
  
  PVar6 = prim[1];
  uVar61 = (ulong)(byte)PVar6;
  auVar86 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar157 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar157 = vinsertps_avx(auVar157,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar149 = *(float *)(prim + uVar61 * 0x19 + 0x12);
  auVar86 = vsubps_avx(auVar86,*(undefined1 (*) [16])(prim + uVar61 * 0x19 + 6));
  auVar98._0_4_ = fVar149 * auVar86._0_4_;
  auVar98._4_4_ = fVar149 * auVar86._4_4_;
  auVar98._8_4_ = fVar149 * auVar86._8_4_;
  auVar98._12_4_ = fVar149 * auVar86._12_4_;
  auVar187._0_4_ = fVar149 * auVar157._0_4_;
  auVar187._4_4_ = fVar149 * auVar157._4_4_;
  auVar187._8_4_ = fVar149 * auVar157._8_4_;
  auVar187._12_4_ = fVar149 * auVar157._12_4_;
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 4 + 6)));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar157 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 5 + 6)));
  auVar157 = vcvtdq2ps_avx(auVar157);
  auVar166 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 6 + 6)));
  auVar166 = vcvtdq2ps_avx(auVar166);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0xb + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar6 * 0xc + uVar61 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  uVar58 = (ulong)(uint)((int)(uVar61 * 9) * 2);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 + uVar61 + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  uVar58 = (ulong)(uint)((int)(uVar61 * 5) << 2);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar68 = vshufps_avx(auVar187,auVar187,0);
  auVar106 = vshufps_avx(auVar187,auVar187,0x55);
  auVar99 = vshufps_avx(auVar187,auVar187,0xaa);
  fVar149 = auVar99._0_4_;
  fVar114 = auVar99._4_4_;
  fVar168 = auVar99._8_4_;
  fVar131 = auVar99._12_4_;
  fVar171 = auVar106._0_4_;
  fVar184 = auVar106._4_4_;
  fVar185 = auVar106._8_4_;
  fVar186 = auVar106._12_4_;
  fVar169 = auVar68._0_4_;
  fVar132 = auVar68._4_4_;
  fVar170 = auVar68._8_4_;
  fVar133 = auVar68._12_4_;
  auVar257._0_4_ = fVar169 * auVar86._0_4_ + fVar171 * auVar157._0_4_ + fVar149 * auVar166._0_4_;
  auVar257._4_4_ = fVar132 * auVar86._4_4_ + fVar184 * auVar157._4_4_ + fVar114 * auVar166._4_4_;
  auVar257._8_4_ = fVar170 * auVar86._8_4_ + fVar185 * auVar157._8_4_ + fVar168 * auVar166._8_4_;
  auVar257._12_4_ = fVar133 * auVar86._12_4_ + fVar186 * auVar157._12_4_ + fVar131 * auVar166._12_4_
  ;
  auVar272._0_4_ = fVar169 * auVar11._0_4_ + fVar171 * auVar12._0_4_ + auVar13._0_4_ * fVar149;
  auVar272._4_4_ = fVar132 * auVar11._4_4_ + fVar184 * auVar12._4_4_ + auVar13._4_4_ * fVar114;
  auVar272._8_4_ = fVar170 * auVar11._8_4_ + fVar185 * auVar12._8_4_ + auVar13._8_4_ * fVar168;
  auVar272._12_4_ = fVar133 * auVar11._12_4_ + fVar186 * auVar12._12_4_ + auVar13._12_4_ * fVar131;
  auVar188._0_4_ = fVar169 * auVar65._0_4_ + fVar171 * auVar85._0_4_ + auVar77._0_4_ * fVar149;
  auVar188._4_4_ = fVar132 * auVar65._4_4_ + fVar184 * auVar85._4_4_ + auVar77._4_4_ * fVar114;
  auVar188._8_4_ = fVar170 * auVar65._8_4_ + fVar185 * auVar85._8_4_ + auVar77._8_4_ * fVar168;
  auVar188._12_4_ = fVar133 * auVar65._12_4_ + fVar186 * auVar85._12_4_ + auVar77._12_4_ * fVar131;
  auVar68 = vshufps_avx(auVar98,auVar98,0);
  auVar106 = vshufps_avx(auVar98,auVar98,0x55);
  auVar99 = vshufps_avx(auVar98,auVar98,0xaa);
  fVar149 = auVar99._0_4_;
  fVar114 = auVar99._4_4_;
  fVar168 = auVar99._8_4_;
  fVar131 = auVar99._12_4_;
  fVar171 = auVar106._0_4_;
  fVar184 = auVar106._4_4_;
  fVar185 = auVar106._8_4_;
  fVar186 = auVar106._12_4_;
  fVar169 = auVar68._0_4_;
  fVar132 = auVar68._4_4_;
  fVar170 = auVar68._8_4_;
  fVar133 = auVar68._12_4_;
  auVar134._0_4_ = fVar169 * auVar86._0_4_ + fVar171 * auVar157._0_4_ + fVar149 * auVar166._0_4_;
  auVar134._4_4_ = fVar132 * auVar86._4_4_ + fVar184 * auVar157._4_4_ + fVar114 * auVar166._4_4_;
  auVar134._8_4_ = fVar170 * auVar86._8_4_ + fVar185 * auVar157._8_4_ + fVar168 * auVar166._8_4_;
  auVar134._12_4_ = fVar133 * auVar86._12_4_ + fVar186 * auVar157._12_4_ + fVar131 * auVar166._12_4_
  ;
  auVar106._0_4_ = fVar169 * auVar11._0_4_ + auVar13._0_4_ * fVar149 + fVar171 * auVar12._0_4_;
  auVar106._4_4_ = fVar132 * auVar11._4_4_ + auVar13._4_4_ * fVar114 + fVar184 * auVar12._4_4_;
  auVar106._8_4_ = fVar170 * auVar11._8_4_ + auVar13._8_4_ * fVar168 + fVar185 * auVar12._8_4_;
  auVar106._12_4_ = fVar133 * auVar11._12_4_ + auVar13._12_4_ * fVar131 + fVar186 * auVar12._12_4_;
  auVar68._0_4_ = fVar169 * auVar65._0_4_ + fVar171 * auVar85._0_4_ + auVar77._0_4_ * fVar149;
  auVar68._4_4_ = fVar132 * auVar65._4_4_ + fVar184 * auVar85._4_4_ + auVar77._4_4_ * fVar114;
  auVar68._8_4_ = fVar170 * auVar65._8_4_ + fVar185 * auVar85._8_4_ + auVar77._8_4_ * fVar168;
  auVar68._12_4_ = fVar133 * auVar65._12_4_ + fVar186 * auVar85._12_4_ + auVar77._12_4_ * fVar131;
  auVar172._8_4_ = 0x7fffffff;
  auVar172._0_8_ = 0x7fffffff7fffffff;
  auVar172._12_4_ = 0x7fffffff;
  auVar86 = vandps_avx(auVar257,auVar172);
  auVar115._8_4_ = 0x219392ef;
  auVar115._0_8_ = 0x219392ef219392ef;
  auVar115._12_4_ = 0x219392ef;
  auVar86 = vcmpps_avx(auVar86,auVar115,1);
  auVar157 = vblendvps_avx(auVar257,auVar115,auVar86);
  auVar86 = vandps_avx(auVar272,auVar172);
  auVar86 = vcmpps_avx(auVar86,auVar115,1);
  auVar166 = vblendvps_avx(auVar272,auVar115,auVar86);
  auVar86 = vandps_avx(auVar188,auVar172);
  auVar86 = vcmpps_avx(auVar86,auVar115,1);
  auVar86 = vblendvps_avx(auVar188,auVar115,auVar86);
  auVar11 = vrcpps_avx(auVar157);
  fVar171 = auVar11._0_4_;
  auVar99._0_4_ = fVar171 * auVar157._0_4_;
  fVar184 = auVar11._4_4_;
  auVar99._4_4_ = fVar184 * auVar157._4_4_;
  fVar185 = auVar11._8_4_;
  auVar99._8_4_ = fVar185 * auVar157._8_4_;
  fVar186 = auVar11._12_4_;
  auVar99._12_4_ = fVar186 * auVar157._12_4_;
  auVar189._8_4_ = 0x3f800000;
  auVar189._0_8_ = &DAT_3f8000003f800000;
  auVar189._12_4_ = 0x3f800000;
  auVar157 = vsubps_avx(auVar189,auVar99);
  fVar171 = fVar171 + fVar171 * auVar157._0_4_;
  fVar184 = fVar184 + fVar184 * auVar157._4_4_;
  fVar185 = fVar185 + fVar185 * auVar157._8_4_;
  fVar186 = fVar186 + fVar186 * auVar157._12_4_;
  auVar157 = vrcpps_avx(auVar166);
  fVar149 = auVar157._0_4_;
  auVar150._0_4_ = fVar149 * auVar166._0_4_;
  fVar168 = auVar157._4_4_;
  auVar150._4_4_ = fVar168 * auVar166._4_4_;
  fVar169 = auVar157._8_4_;
  auVar150._8_4_ = fVar169 * auVar166._8_4_;
  fVar170 = auVar157._12_4_;
  auVar150._12_4_ = fVar170 * auVar166._12_4_;
  auVar157 = vsubps_avx(auVar189,auVar150);
  fVar149 = fVar149 + fVar149 * auVar157._0_4_;
  fVar168 = fVar168 + fVar168 * auVar157._4_4_;
  fVar169 = fVar169 + fVar169 * auVar157._8_4_;
  fVar170 = fVar170 + fVar170 * auVar157._12_4_;
  auVar157 = vrcpps_avx(auVar86);
  fVar114 = auVar157._0_4_;
  auVar116._0_4_ = fVar114 * auVar86._0_4_;
  fVar131 = auVar157._4_4_;
  auVar116._4_4_ = fVar131 * auVar86._4_4_;
  fVar132 = auVar157._8_4_;
  auVar116._8_4_ = fVar132 * auVar86._8_4_;
  fVar133 = auVar157._12_4_;
  auVar116._12_4_ = fVar133 * auVar86._12_4_;
  auVar86 = vsubps_avx(auVar189,auVar116);
  fVar114 = fVar114 + fVar114 * auVar86._0_4_;
  fVar131 = fVar131 + fVar131 * auVar86._4_4_;
  fVar132 = fVar132 + fVar132 * auVar86._8_4_;
  fVar133 = fVar133 + fVar133 * auVar86._12_4_;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar61 * 7 + 6);
  auVar86 = vpmovsxwd_avx(auVar86);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,auVar134);
  auVar100._0_4_ = fVar171 * auVar86._0_4_;
  auVar100._4_4_ = fVar184 * auVar86._4_4_;
  auVar100._8_4_ = fVar185 * auVar86._8_4_;
  auVar100._12_4_ = fVar186 * auVar86._12_4_;
  auVar157._8_8_ = 0;
  auVar157._0_8_ = *(ulong *)(prim + uVar61 * 9 + 6);
  auVar86 = vpmovsxwd_avx(auVar157);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,auVar134);
  auVar135._0_4_ = fVar171 * auVar86._0_4_;
  auVar135._4_4_ = fVar184 * auVar86._4_4_;
  auVar135._8_4_ = fVar185 * auVar86._8_4_;
  auVar135._12_4_ = fVar186 * auVar86._12_4_;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  auVar157 = vpmovsxwd_avx(auVar166);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar61 * -2 + 6);
  auVar86 = vpmovsxwd_avx(auVar11);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,auVar106);
  auVar201._0_4_ = auVar86._0_4_ * fVar149;
  auVar201._4_4_ = auVar86._4_4_ * fVar168;
  auVar201._8_4_ = auVar86._8_4_ * fVar169;
  auVar201._12_4_ = auVar86._12_4_ * fVar170;
  auVar86 = vcvtdq2ps_avx(auVar157);
  auVar86 = vsubps_avx(auVar86,auVar106);
  auVar77._0_4_ = fVar149 * auVar86._0_4_;
  auVar77._4_4_ = fVar168 * auVar86._4_4_;
  auVar77._8_4_ = fVar169 * auVar86._8_4_;
  auVar77._12_4_ = fVar170 * auVar86._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar58 + uVar61 + 6);
  auVar86 = vpmovsxwd_avx(auVar12);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,auVar68);
  auVar151._0_4_ = auVar86._0_4_ * fVar114;
  auVar151._4_4_ = auVar86._4_4_ * fVar131;
  auVar151._8_4_ = auVar86._8_4_ * fVar132;
  auVar151._12_4_ = auVar86._12_4_ * fVar133;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar61 * 0x17 + 6);
  auVar86 = vpmovsxwd_avx(auVar13);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,auVar68);
  auVar65._0_4_ = auVar86._0_4_ * fVar114;
  auVar65._4_4_ = auVar86._4_4_ * fVar131;
  auVar65._8_4_ = auVar86._8_4_ * fVar132;
  auVar65._12_4_ = auVar86._12_4_ * fVar133;
  auVar86 = vpminsd_avx(auVar100,auVar135);
  auVar157 = vpminsd_avx(auVar201,auVar77);
  auVar86 = vmaxps_avx(auVar86,auVar157);
  auVar157 = vpminsd_avx(auVar151,auVar65);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar218._4_4_ = uVar4;
  auVar218._0_4_ = uVar4;
  auVar218._8_4_ = uVar4;
  auVar218._12_4_ = uVar4;
  auVar157 = vmaxps_avx(auVar157,auVar218);
  auVar86 = vmaxps_avx(auVar86,auVar157);
  local_338._0_4_ = auVar86._0_4_ * 0.99999964;
  local_338._4_4_ = auVar86._4_4_ * 0.99999964;
  local_338._8_4_ = auVar86._8_4_ * 0.99999964;
  local_338._12_4_ = auVar86._12_4_ * 0.99999964;
  auVar86 = vpmaxsd_avx(auVar100,auVar135);
  auVar157 = vpmaxsd_avx(auVar201,auVar77);
  auVar86 = vminps_avx(auVar86,auVar157);
  auVar157 = vpmaxsd_avx(auVar151,auVar65);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar101._4_4_ = uVar4;
  auVar101._0_4_ = uVar4;
  auVar101._8_4_ = uVar4;
  auVar101._12_4_ = uVar4;
  auVar157 = vminps_avx(auVar157,auVar101);
  auVar86 = vminps_avx(auVar86,auVar157);
  auVar85._0_4_ = auVar86._0_4_ * 1.0000004;
  auVar85._4_4_ = auVar86._4_4_ * 1.0000004;
  auVar85._8_4_ = auVar86._8_4_ * 1.0000004;
  auVar85._12_4_ = auVar86._12_4_ * 1.0000004;
  auVar86 = vpshufd_avx(ZEXT116((byte)PVar6),0);
  auVar157 = vpcmpgtd_avx(auVar86,_DAT_01ff0cf0);
  auVar86 = vcmpps_avx(local_338,auVar85,2);
  auVar86 = vandps_avx(auVar86,auVar157);
  uVar55 = vmovmskps_avx(auVar86);
  if (uVar55 == 0) {
    return;
  }
  uVar55 = uVar55 & 0xff;
  auVar71._16_16_ = mm_lookupmask_ps._240_16_;
  auVar71._0_16_ = mm_lookupmask_ps._240_16_;
  local_228 = vblendps_avx(auVar71,ZEXT832(0) << 0x20,0x80);
  local_440 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar298 = ZEXT464(0) << 0x20;
LAB_00f3b2b7:
  lVar59 = 0;
  if ((ulong)uVar55 != 0) {
    for (; (uVar55 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
    }
  }
  uVar57 = *(uint *)(prim + 2);
  local_438 = (ulong)*(uint *)(prim + lVar59 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar57].ptr;
  lVar8 = *(long *)&pGVar7[1].time_range.upper;
  uVar58 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           local_438 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  pfVar2 = (float *)(lVar8 + (long)pGVar7[1].intersectionFilterN * uVar58);
  fVar171 = *pfVar2;
  fVar184 = pfVar2[1];
  fVar185 = pfVar2[2];
  fVar186 = pfVar2[3];
  lVar1 = uVar58 + 1;
  auVar86 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * lVar1);
  pfVar2 = (float *)(pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * uVar58);
  _Var9 = pGVar7[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar3 = (float *)(pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * lVar1);
  auVar102._0_4_ = *pfVar3 * 0.33333334;
  auVar102._4_4_ = pfVar3[1] * 0.33333334;
  auVar102._8_4_ = pfVar3[2] * 0.33333334;
  auVar102._12_4_ = pfVar3[3] * 0.33333334;
  pfVar3 = (float *)(_Var9 + (long)pGVar7[2].userPtr * uVar58);
  fVar63 = *pfVar3;
  fVar64 = pfVar3[1];
  fVar75 = pfVar3[2];
  fVar76 = pfVar3[3];
  pfVar3 = (float *)((long)pGVar7[3].userPtr + uVar58 * *(long *)&pGVar7[3].fnumTimeSegments);
  auVar157 = *(undefined1 (*) [16])(_Var9 + (long)pGVar7[2].userPtr * lVar1);
  auVar166 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar11 = vinsertps_avx(auVar166,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar200 = fVar171 + *pfVar2 * 0.33333334;
  fVar215 = fVar184 + pfVar2[1] * 0.33333334;
  fVar216 = fVar185 + pfVar2[2] * 0.33333334;
  fVar217 = fVar186 + pfVar2[3] * 0.33333334;
  auVar166 = vsubps_avx(auVar86,auVar102);
  fVar234 = fVar63 + *pfVar3 * 0.33333334;
  fVar243 = fVar64 + pfVar3[1] * 0.33333334;
  fVar244 = fVar75 + pfVar3[2] * 0.33333334;
  fVar245 = fVar76 + pfVar3[3] * 0.33333334;
  pfVar2 = (float *)((long)pGVar7[3].userPtr + *(long *)&pGVar7[3].fnumTimeSegments * lVar1);
  auVar78._0_4_ = *pfVar2 * 0.33333334;
  auVar78._4_4_ = pfVar2[1] * 0.33333334;
  auVar78._8_4_ = pfVar2[2] * 0.33333334;
  auVar78._12_4_ = pfVar2[3] * 0.33333334;
  auVar12 = vsubps_avx(auVar157,auVar78);
  fVar149 = auVar86._0_4_;
  fVar168 = auVar86._4_4_;
  fVar169 = auVar86._8_4_;
  fVar290 = auVar298._8_4_;
  fVar170 = auVar86._12_4_;
  fVar292 = auVar298._12_4_;
  fVar246 = auVar166._0_4_ * 0.0;
  fVar253 = auVar166._4_4_ * 0.0;
  fVar254 = auVar166._8_4_ * fVar290;
  fVar255 = auVar166._12_4_ * fVar292;
  fVar114 = fVar246 + fVar149 * 0.0;
  fVar131 = fVar253 + fVar168 * 0.0;
  fVar132 = fVar254 + fVar290 * fVar169;
  fVar133 = fVar255 + fVar292 * fVar170;
  fVar256 = fVar200 * 0.0;
  fVar261 = fVar215 * 0.0;
  fVar262 = fVar216 * fVar290;
  fVar263 = fVar217 * fVar292;
  local_5d8._0_4_ = fVar171 + fVar256 + fVar114;
  local_5d8._4_4_ = fVar184 + fVar261 + fVar131;
  fStack_5d0 = fVar185 + fVar262 + fVar132;
  fStack_5cc = fVar186 + fVar263 + fVar133;
  auVar103._0_4_ = fVar200 * 3.0 + fVar114;
  auVar103._4_4_ = fVar215 * 3.0 + fVar131;
  auVar103._8_4_ = fVar216 * 3.0 + fVar132;
  auVar103._12_4_ = fVar217 * 3.0 + fVar133;
  auVar202._0_4_ = fVar171 * 3.0;
  auVar202._4_4_ = fVar184 * 3.0;
  auVar202._8_4_ = fVar185 * 3.0;
  auVar202._12_4_ = fVar186 * 3.0;
  auVar106 = vsubps_avx(auVar103,auVar202);
  fVar114 = auVar157._0_4_;
  fVar131 = auVar157._4_4_;
  fVar132 = auVar157._8_4_;
  fVar133 = auVar157._12_4_;
  fVar271 = auVar12._0_4_ * 0.0;
  fVar278 = auVar12._4_4_ * 0.0;
  fVar279 = fVar290 * auVar12._8_4_;
  fVar280 = fVar292 * auVar12._12_4_;
  fVar200 = fVar114 * 0.0 + fVar271;
  fVar215 = fVar131 * 0.0 + fVar278;
  fVar216 = fVar290 * fVar132 + fVar279;
  fVar217 = fVar292 * fVar133 + fVar280;
  fVar283 = fVar234 * 0.0;
  fVar288 = fVar243 * 0.0;
  fVar290 = fVar244 * fVar290;
  fVar292 = fVar245 * fVar292;
  auVar293._0_4_ = fVar283 + fVar200 + fVar63;
  auVar293._4_4_ = fVar288 + fVar215 + fVar64;
  auVar293._8_4_ = fVar290 + fVar216 + fVar75;
  auVar293._12_4_ = fVar292 + fVar217 + fVar76;
  auVar203._0_4_ = fVar234 * 3.0 + fVar200;
  auVar203._4_4_ = fVar243 * 3.0 + fVar215;
  auVar203._8_4_ = fVar244 * 3.0 + fVar216;
  auVar203._12_4_ = fVar245 * 3.0 + fVar217;
  auVar235._0_4_ = fVar63 * 3.0;
  auVar235._4_4_ = fVar64 * 3.0;
  auVar235._8_4_ = fVar75 * 3.0;
  auVar235._12_4_ = fVar76 * 3.0;
  auVar13 = vsubps_avx(auVar203,auVar235);
  auVar247._0_4_ = fVar171 * 0.0;
  auVar247._4_4_ = fVar184 * 0.0;
  auVar247._8_4_ = fVar185 * 0.0;
  auVar247._12_4_ = fVar186 * 0.0;
  auVar117._0_4_ = auVar247._0_4_ + fVar256 + fVar246 + fVar149;
  auVar117._4_4_ = auVar247._4_4_ + fVar261 + fVar253 + fVar168;
  auVar117._8_4_ = auVar247._8_4_ + fVar262 + fVar254 + fVar169;
  auVar117._12_4_ = auVar247._12_4_ + fVar263 + fVar255 + fVar170;
  auVar136._0_4_ = fVar149 * 3.0;
  auVar136._4_4_ = fVar168 * 3.0;
  auVar136._8_4_ = fVar169 * 3.0;
  auVar136._12_4_ = fVar170 * 3.0;
  auVar204._0_4_ = auVar166._0_4_ * 3.0;
  auVar204._4_4_ = auVar166._4_4_ * 3.0;
  auVar204._8_4_ = auVar166._8_4_ * 3.0;
  auVar204._12_4_ = auVar166._12_4_ * 3.0;
  auVar86 = vsubps_avx(auVar136,auVar204);
  auVar137._0_4_ = fVar256 + auVar86._0_4_;
  auVar137._4_4_ = fVar261 + auVar86._4_4_;
  auVar137._8_4_ = fVar262 + auVar86._8_4_;
  auVar137._12_4_ = fVar263 + auVar86._12_4_;
  auVar99 = vsubps_avx(auVar137,auVar247);
  auVar152._0_4_ = fVar63 * 0.0;
  auVar152._4_4_ = fVar64 * 0.0;
  auVar152._8_4_ = fVar75 * 0.0;
  auVar152._12_4_ = fVar76 * 0.0;
  auVar219._0_4_ = fVar283 + fVar271 + fVar114 + auVar152._0_4_;
  auVar219._4_4_ = fVar288 + fVar278 + fVar131 + auVar152._4_4_;
  auVar219._8_4_ = fVar290 + fVar279 + fVar132 + auVar152._8_4_;
  auVar219._12_4_ = fVar292 + fVar280 + fVar133 + auVar152._12_4_;
  auVar173._0_4_ = fVar114 * 3.0;
  auVar173._4_4_ = fVar131 * 3.0;
  auVar173._8_4_ = fVar132 * 3.0;
  auVar173._12_4_ = fVar133 * 3.0;
  auVar190._0_4_ = auVar12._0_4_ * 3.0;
  auVar190._4_4_ = auVar12._4_4_ * 3.0;
  auVar190._8_4_ = auVar12._8_4_ * 3.0;
  auVar190._12_4_ = auVar12._12_4_ * 3.0;
  auVar86 = vsubps_avx(auVar173,auVar190);
  auVar174._0_4_ = fVar283 + auVar86._0_4_;
  auVar174._4_4_ = fVar288 + auVar86._4_4_;
  auVar174._8_4_ = fVar290 + auVar86._8_4_;
  auVar174._12_4_ = fVar292 + auVar86._12_4_;
  auVar65 = vsubps_avx(auVar174,auVar152);
  auVar86 = vshufps_avx(auVar106,auVar106,0xc9);
  auVar157 = vshufps_avx(auVar293,auVar293,0xc9);
  fVar200 = auVar106._0_4_;
  auVar191._0_4_ = fVar200 * auVar157._0_4_;
  fVar215 = auVar106._4_4_;
  auVar191._4_4_ = fVar215 * auVar157._4_4_;
  fVar216 = auVar106._8_4_;
  auVar191._8_4_ = fVar216 * auVar157._8_4_;
  fVar217 = auVar106._12_4_;
  auVar191._12_4_ = fVar217 * auVar157._12_4_;
  auVar205._0_4_ = auVar293._0_4_ * auVar86._0_4_;
  auVar205._4_4_ = auVar293._4_4_ * auVar86._4_4_;
  auVar205._8_4_ = auVar293._8_4_ * auVar86._8_4_;
  auVar205._12_4_ = auVar293._12_4_ * auVar86._12_4_;
  auVar157 = vsubps_avx(auVar205,auVar191);
  auVar166 = vshufps_avx(auVar157,auVar157,0xc9);
  auVar157 = vshufps_avx(auVar13,auVar13,0xc9);
  auVar192._0_4_ = fVar200 * auVar157._0_4_;
  auVar192._4_4_ = fVar215 * auVar157._4_4_;
  auVar192._8_4_ = fVar216 * auVar157._8_4_;
  auVar192._12_4_ = fVar217 * auVar157._12_4_;
  auVar153._0_4_ = auVar13._0_4_ * auVar86._0_4_;
  auVar153._4_4_ = auVar13._4_4_ * auVar86._4_4_;
  auVar153._8_4_ = auVar13._8_4_ * auVar86._8_4_;
  auVar153._12_4_ = auVar13._12_4_ * auVar86._12_4_;
  auVar86 = vsubps_avx(auVar153,auVar192);
  auVar12 = vshufps_avx(auVar86,auVar86,0xc9);
  auVar86 = vshufps_avx(auVar99,auVar99,0xc9);
  auVar157 = vshufps_avx(auVar219,auVar219,0xc9);
  fVar234 = auVar99._0_4_;
  auVar154._0_4_ = fVar234 * auVar157._0_4_;
  fVar243 = auVar99._4_4_;
  auVar154._4_4_ = fVar243 * auVar157._4_4_;
  fVar244 = auVar99._8_4_;
  auVar154._8_4_ = fVar244 * auVar157._8_4_;
  fVar245 = auVar99._12_4_;
  auVar154._12_4_ = fVar245 * auVar157._12_4_;
  auVar220._0_4_ = auVar219._0_4_ * auVar86._0_4_;
  auVar220._4_4_ = auVar219._4_4_ * auVar86._4_4_;
  auVar220._8_4_ = auVar219._8_4_ * auVar86._8_4_;
  auVar220._12_4_ = auVar219._12_4_ * auVar86._12_4_;
  auVar157 = vsubps_avx(auVar220,auVar154);
  auVar13 = vshufps_avx(auVar157,auVar157,0xc9);
  auVar157 = vshufps_avx(auVar65,auVar65,0xc9);
  auVar221._0_4_ = auVar157._0_4_ * fVar234;
  auVar221._4_4_ = auVar157._4_4_ * fVar243;
  auVar221._8_4_ = auVar157._8_4_ * fVar244;
  auVar221._12_4_ = auVar157._12_4_ * fVar245;
  auVar175._0_4_ = auVar86._0_4_ * auVar65._0_4_;
  auVar175._4_4_ = auVar86._4_4_ * auVar65._4_4_;
  auVar175._8_4_ = auVar86._8_4_ * auVar65._8_4_;
  auVar175._12_4_ = auVar86._12_4_ * auVar65._12_4_;
  auVar157 = vsubps_avx(auVar175,auVar221);
  auVar86 = vdpps_avx(auVar166,auVar166,0x7f);
  auVar65 = vshufps_avx(auVar157,auVar157,0xc9);
  fVar169 = auVar86._0_4_;
  auVar77 = ZEXT416((uint)fVar169);
  auVar157 = vrsqrtss_avx(auVar77,auVar77);
  fVar149 = auVar157._0_4_;
  auVar157 = vdpps_avx(auVar166,auVar12,0x7f);
  auVar85 = ZEXT416((uint)(fVar149 * 1.5 - fVar169 * 0.5 * fVar149 * fVar149 * fVar149));
  auVar85 = vshufps_avx(auVar85,auVar85,0);
  fVar149 = auVar166._0_4_ * auVar85._0_4_;
  fVar114 = auVar166._4_4_ * auVar85._4_4_;
  fVar168 = auVar166._8_4_ * auVar85._8_4_;
  fVar131 = auVar166._12_4_ * auVar85._12_4_;
  auVar86 = vshufps_avx(auVar86,auVar86,0);
  auVar236._0_4_ = auVar86._0_4_ * auVar12._0_4_;
  auVar236._4_4_ = auVar86._4_4_ * auVar12._4_4_;
  auVar236._8_4_ = auVar86._8_4_ * auVar12._8_4_;
  auVar236._12_4_ = auVar86._12_4_ * auVar12._12_4_;
  auVar86 = vshufps_avx(auVar157,auVar157,0);
  auVar206._0_4_ = auVar86._0_4_ * auVar166._0_4_;
  auVar206._4_4_ = auVar86._4_4_ * auVar166._4_4_;
  auVar206._8_4_ = auVar86._8_4_ * auVar166._8_4_;
  auVar206._12_4_ = auVar86._12_4_ * auVar166._12_4_;
  auVar98 = vsubps_avx(auVar236,auVar206);
  auVar86 = vrcpss_avx(auVar77,auVar77);
  auVar157 = vdpps_avx(auVar13,auVar13,0x7f);
  auVar86 = ZEXT416((uint)(auVar86._0_4_ * (2.0 - fVar169 * auVar86._0_4_)));
  auVar12 = vshufps_avx(auVar86,auVar86,0);
  auVar86 = vblendps_avx(auVar157,_DAT_01feba10,0xe);
  auVar166 = vrsqrtss_avx(auVar86,auVar86);
  fVar169 = auVar166._0_4_;
  auVar166 = ZEXT416((uint)(fVar169 * 1.5 - auVar157._0_4_ * 0.5 * fVar169 * fVar169 * fVar169));
  auVar77 = vshufps_avx(auVar166,auVar166,0);
  auVar166 = vdpps_avx(auVar13,auVar65,0x7f);
  fVar169 = auVar77._0_4_ * auVar13._0_4_;
  fVar132 = auVar77._4_4_ * auVar13._4_4_;
  fVar170 = auVar77._8_4_ * auVar13._8_4_;
  fVar133 = auVar77._12_4_ * auVar13._12_4_;
  auVar68 = vshufps_avx(auVar157,auVar157,0);
  auVar193._0_4_ = auVar68._0_4_ * auVar65._0_4_;
  auVar193._4_4_ = auVar68._4_4_ * auVar65._4_4_;
  auVar193._8_4_ = auVar68._8_4_ * auVar65._8_4_;
  auVar193._12_4_ = auVar68._12_4_ * auVar65._12_4_;
  auVar166 = vshufps_avx(auVar166,auVar166,0);
  auVar155._0_4_ = auVar166._0_4_ * auVar13._0_4_;
  auVar155._4_4_ = auVar166._4_4_ * auVar13._4_4_;
  auVar155._8_4_ = auVar166._8_4_ * auVar13._8_4_;
  auVar155._12_4_ = auVar166._12_4_ * auVar13._12_4_;
  auVar13 = vsubps_avx(auVar193,auVar155);
  auVar86 = vrcpss_avx(auVar86,auVar86);
  auVar86 = ZEXT416((uint)((2.0 - auVar157._0_4_ * auVar86._0_4_) * auVar86._0_4_));
  auVar86 = vshufps_avx(auVar86,auVar86,0);
  auVar157 = vshufps_avx(_local_5d8,_local_5d8,0xff);
  auVar222._0_4_ = auVar157._0_4_ * fVar149;
  auVar222._4_4_ = auVar157._4_4_ * fVar114;
  auVar222._8_4_ = auVar157._8_4_ * fVar168;
  auVar222._12_4_ = auVar157._12_4_ * fVar131;
  _local_398 = vsubps_avx(_local_5d8,auVar222);
  auVar166 = vshufps_avx(auVar106,auVar106,0xff);
  auVar176._0_4_ =
       auVar166._0_4_ * fVar149 + auVar85._0_4_ * auVar98._0_4_ * auVar12._0_4_ * auVar157._0_4_;
  auVar176._4_4_ =
       auVar166._4_4_ * fVar114 + auVar85._4_4_ * auVar98._4_4_ * auVar12._4_4_ * auVar157._4_4_;
  auVar176._8_4_ =
       auVar166._8_4_ * fVar168 + auVar85._8_4_ * auVar98._8_4_ * auVar12._8_4_ * auVar157._8_4_;
  auVar176._12_4_ =
       auVar166._12_4_ * fVar131 +
       auVar85._12_4_ * auVar98._12_4_ * auVar12._12_4_ * auVar157._12_4_;
  auVar12 = vsubps_avx(auVar106,auVar176);
  local_3a8._0_4_ = auVar222._0_4_ + (float)local_5d8._0_4_;
  local_3a8._4_4_ = auVar222._4_4_ + (float)local_5d8._4_4_;
  fStack_3a0 = auVar222._8_4_ + fStack_5d0;
  fStack_39c = auVar222._12_4_ + fStack_5cc;
  auVar157 = vshufps_avx(auVar117,auVar117,0xff);
  auVar104._0_4_ = fVar169 * auVar157._0_4_;
  auVar104._4_4_ = fVar132 * auVar157._4_4_;
  auVar104._8_4_ = fVar170 * auVar157._8_4_;
  auVar104._12_4_ = fVar133 * auVar157._12_4_;
  _local_3b8 = vsubps_avx(auVar117,auVar104);
  auVar166 = vshufps_avx(auVar99,auVar99,0xff);
  auVar79._0_4_ =
       fVar169 * auVar166._0_4_ + auVar157._0_4_ * auVar77._0_4_ * auVar13._0_4_ * auVar86._0_4_;
  auVar79._4_4_ =
       fVar132 * auVar166._4_4_ + auVar157._4_4_ * auVar77._4_4_ * auVar13._4_4_ * auVar86._4_4_;
  auVar79._8_4_ =
       fVar170 * auVar166._8_4_ + auVar157._8_4_ * auVar77._8_4_ * auVar13._8_4_ * auVar86._8_4_;
  auVar79._12_4_ =
       fVar133 * auVar166._12_4_ +
       auVar157._12_4_ * auVar77._12_4_ * auVar13._12_4_ * auVar86._12_4_;
  auVar13 = vsubps_avx(auVar99,auVar79);
  local_3c8._0_4_ = auVar117._0_4_ + auVar104._0_4_;
  local_3c8._4_4_ = auVar117._4_4_ + auVar104._4_4_;
  fStack_3c0 = auVar117._8_4_ + auVar104._8_4_;
  fStack_3bc = auVar117._12_4_ + auVar104._12_4_;
  local_3d8._0_4_ = local_398._0_4_ + auVar12._0_4_ * 0.33333334;
  local_3d8._4_4_ = local_398._4_4_ + auVar12._4_4_ * 0.33333334;
  fStack_3d0 = local_398._8_4_ + auVar12._8_4_ * 0.33333334;
  fStack_3cc = local_398._12_4_ + auVar12._12_4_ * 0.33333334;
  local_268 = vsubps_avx(_local_398,auVar11);
  auVar157 = vmovsldup_avx(local_268);
  auVar86 = vmovshdup_avx(local_268);
  auVar166 = vshufps_avx(local_268,local_268,0xaa);
  fVar149 = pre->ray_space[k].vx.field_0.m128[0];
  fVar114 = pre->ray_space[k].vx.field_0.m128[1];
  fVar168 = pre->ray_space[k].vx.field_0.m128[2];
  fVar131 = pre->ray_space[k].vx.field_0.m128[3];
  fVar169 = pre->ray_space[k].vy.field_0.m128[0];
  fVar132 = pre->ray_space[k].vy.field_0.m128[1];
  fVar170 = pre->ray_space[k].vy.field_0.m128[2];
  fVar133 = pre->ray_space[k].vy.field_0.m128[3];
  fVar171 = pre->ray_space[k].vz.field_0.m128[0];
  fVar184 = pre->ray_space[k].vz.field_0.m128[1];
  fVar185 = pre->ray_space[k].vz.field_0.m128[2];
  fVar186 = pre->ray_space[k].vz.field_0.m128[3];
  fVar63 = fVar149 * auVar157._0_4_ + auVar166._0_4_ * fVar171 + fVar169 * auVar86._0_4_;
  fVar75 = fVar114 * auVar157._4_4_ + auVar166._4_4_ * fVar184 + fVar132 * auVar86._4_4_;
  local_5d8._4_4_ = fVar75;
  local_5d8._0_4_ = fVar63;
  fStack_5d0 = fVar168 * auVar157._8_4_ + auVar166._8_4_ * fVar185 + fVar170 * auVar86._8_4_;
  fStack_5cc = fVar131 * auVar157._12_4_ + auVar166._12_4_ * fVar186 + fVar133 * auVar86._12_4_;
  local_278 = vsubps_avx(_local_3d8,auVar11);
  auVar166 = vshufps_avx(local_278,local_278,0xaa);
  auVar86 = vmovshdup_avx(local_278);
  auVar157 = vmovsldup_avx(local_278);
  fVar64 = auVar157._0_4_ * fVar149 + auVar86._0_4_ * fVar169 + fVar171 * auVar166._0_4_;
  fVar76 = auVar157._4_4_ * fVar114 + auVar86._4_4_ * fVar132 + fVar184 * auVar166._4_4_;
  local_578._4_4_ = fVar76;
  local_578._0_4_ = fVar64;
  fStack_570 = auVar157._8_4_ * fVar168 + auVar86._8_4_ * fVar170 + fVar185 * auVar166._8_4_;
  fStack_56c = auVar157._12_4_ * fVar131 + auVar86._12_4_ * fVar133 + fVar186 * auVar166._12_4_;
  auVar156._0_4_ = auVar13._0_4_ * 0.33333334;
  auVar156._4_4_ = auVar13._4_4_ * 0.33333334;
  auVar156._8_4_ = auVar13._8_4_ * 0.33333334;
  auVar156._12_4_ = auVar13._12_4_ * 0.33333334;
  _local_3e8 = vsubps_avx(_local_3b8,auVar156);
  local_288 = vsubps_avx(_local_3e8,auVar11);
  auVar166 = vshufps_avx(local_288,local_288,0xaa);
  auVar86 = vmovshdup_avx(local_288);
  auVar157 = vmovsldup_avx(local_288);
  auVar273._0_4_ = auVar157._0_4_ * fVar149 + auVar86._0_4_ * fVar169 + fVar171 * auVar166._0_4_;
  auVar273._4_4_ = auVar157._4_4_ * fVar114 + auVar86._4_4_ * fVar132 + fVar184 * auVar166._4_4_;
  auVar273._8_4_ = auVar157._8_4_ * fVar168 + auVar86._8_4_ * fVar170 + fVar185 * auVar166._8_4_;
  auVar273._12_4_ = auVar157._12_4_ * fVar131 + auVar86._12_4_ * fVar133 + fVar186 * auVar166._12_4_
  ;
  local_298 = vsubps_avx(_local_3b8,auVar11);
  auVar166 = vshufps_avx(local_298,local_298,0xaa);
  auVar86 = vmovshdup_avx(local_298);
  auVar157 = vmovsldup_avx(local_298);
  auVar258._0_8_ =
       CONCAT44(auVar157._4_4_ * fVar114 + auVar86._4_4_ * fVar132 + auVar166._4_4_ * fVar184,
                auVar157._0_4_ * fVar149 + auVar86._0_4_ * fVar169 + auVar166._0_4_ * fVar171);
  auVar258._8_4_ = auVar157._8_4_ * fVar168 + auVar86._8_4_ * fVar170 + auVar166._8_4_ * fVar185;
  auVar258._12_4_ = auVar157._12_4_ * fVar131 + auVar86._12_4_ * fVar133 + auVar166._12_4_ * fVar186
  ;
  local_2a8 = vsubps_avx(_local_3a8,auVar11);
  auVar166 = vshufps_avx(local_2a8,local_2a8,0xaa);
  auVar86 = vmovshdup_avx(local_2a8);
  auVar157 = vmovsldup_avx(local_2a8);
  auVar237._0_4_ = auVar157._0_4_ * fVar149 + auVar86._0_4_ * fVar169 + auVar166._0_4_ * fVar171;
  auVar237._4_4_ = auVar157._4_4_ * fVar114 + auVar86._4_4_ * fVar132 + auVar166._4_4_ * fVar184;
  auVar237._8_4_ = auVar157._8_4_ * fVar168 + auVar86._8_4_ * fVar170 + auVar166._8_4_ * fVar185;
  auVar237._12_4_ = auVar157._12_4_ * fVar131 + auVar86._12_4_ * fVar133 + auVar166._12_4_ * fVar186
  ;
  local_3f8._0_4_ = (float)local_3a8._0_4_ + (fVar200 + auVar176._0_4_) * 0.33333334;
  local_3f8._4_4_ = (float)local_3a8._4_4_ + (fVar215 + auVar176._4_4_) * 0.33333334;
  fStack_3f0 = fStack_3a0 + (fVar216 + auVar176._8_4_) * 0.33333334;
  fStack_3ec = fStack_39c + (fVar217 + auVar176._12_4_) * 0.33333334;
  local_2b8 = vsubps_avx(_local_3f8,auVar11);
  auVar166 = vshufps_avx(local_2b8,local_2b8,0xaa);
  auVar86 = vmovshdup_avx(local_2b8);
  auVar157 = vmovsldup_avx(local_2b8);
  auVar223._0_4_ = auVar157._0_4_ * fVar149 + auVar86._0_4_ * fVar169 + auVar166._0_4_ * fVar171;
  auVar223._4_4_ = auVar157._4_4_ * fVar114 + auVar86._4_4_ * fVar132 + auVar166._4_4_ * fVar184;
  auVar223._8_4_ = auVar157._8_4_ * fVar168 + auVar86._8_4_ * fVar170 + auVar166._8_4_ * fVar185;
  auVar223._12_4_ = auVar157._12_4_ * fVar131 + auVar86._12_4_ * fVar133 + auVar166._12_4_ * fVar186
  ;
  auVar194._0_4_ = (fVar234 + auVar79._0_4_) * 0.33333334;
  auVar194._4_4_ = (fVar243 + auVar79._4_4_) * 0.33333334;
  auVar194._8_4_ = (fVar244 + auVar79._8_4_) * 0.33333334;
  auVar194._12_4_ = (fVar245 + auVar79._12_4_) * 0.33333334;
  _local_2e8 = vsubps_avx(_local_3c8,auVar194);
  local_2c8 = vsubps_avx(_local_2e8,auVar11);
  auVar166 = vshufps_avx(local_2c8,local_2c8,0xaa);
  auVar86 = vmovshdup_avx(local_2c8);
  auVar157 = vmovsldup_avx(local_2c8);
  auVar80._0_4_ = auVar157._0_4_ * fVar149 + auVar86._0_4_ * fVar169 + fVar171 * auVar166._0_4_;
  auVar80._4_4_ = auVar157._4_4_ * fVar114 + auVar86._4_4_ * fVar132 + fVar184 * auVar166._4_4_;
  auVar80._8_4_ = auVar157._8_4_ * fVar168 + auVar86._8_4_ * fVar170 + fVar185 * auVar166._8_4_;
  auVar80._12_4_ = auVar157._12_4_ * fVar131 + auVar86._12_4_ * fVar133 + fVar186 * auVar166._12_4_;
  local_2d8 = vsubps_avx(_local_3c8,auVar11);
  auVar166 = vshufps_avx(local_2d8,local_2d8,0xaa);
  auVar86 = vmovshdup_avx(local_2d8);
  auVar157 = vmovsldup_avx(local_2d8);
  auVar66._0_4_ = fVar149 * auVar157._0_4_ + fVar169 * auVar86._0_4_ + fVar171 * auVar166._0_4_;
  auVar66._4_4_ = fVar114 * auVar157._4_4_ + fVar132 * auVar86._4_4_ + fVar184 * auVar166._4_4_;
  auVar66._8_4_ = fVar168 * auVar157._8_4_ + fVar170 * auVar86._8_4_ + fVar185 * auVar166._8_4_;
  auVar66._12_4_ = fVar131 * auVar157._12_4_ + fVar133 * auVar86._12_4_ + fVar186 * auVar166._12_4_;
  auVar11 = vmovlhps_avx(_local_5d8,auVar237);
  auVar12 = vmovlhps_avx(_local_578,auVar223);
  auVar13 = vmovlhps_avx(auVar273,auVar80);
  _local_388 = vmovlhps_avx(auVar258,auVar66);
  auVar86 = vminps_avx(auVar11,auVar12);
  auVar157 = vminps_avx(auVar13,_local_388);
  auVar166 = vminps_avx(auVar86,auVar157);
  auVar86 = vmaxps_avx(auVar11,auVar12);
  auVar157 = vmaxps_avx(auVar13,_local_388);
  auVar86 = vmaxps_avx(auVar86,auVar157);
  auVar157 = vshufpd_avx(auVar166,auVar166,3);
  auVar166 = vminps_avx(auVar166,auVar157);
  auVar157 = vshufpd_avx(auVar86,auVar86,3);
  auVar157 = vmaxps_avx(auVar86,auVar157);
  auVar177._8_4_ = 0x7fffffff;
  auVar177._0_8_ = 0x7fffffff7fffffff;
  auVar177._12_4_ = 0x7fffffff;
  auVar86 = vandps_avx(auVar166,auVar177);
  auVar157 = vandps_avx(auVar157,auVar177);
  auVar86 = vmaxps_avx(auVar86,auVar157);
  auVar157 = vmovshdup_avx(auVar86);
  auVar86 = vmaxss_avx(auVar157,auVar86);
  local_430 = (ulong)uVar55 + 0xf;
  fVar114 = auVar86._0_4_ * 9.536743e-07;
  register0x00001508 = auVar258._0_8_;
  local_378 = auVar258._0_8_;
  auVar86 = vshufps_avx(ZEXT416((uint)fVar114),ZEXT416((uint)fVar114),0);
  local_138._16_16_ = auVar86;
  local_138._0_16_ = auVar86;
  auVar67._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
  auVar67._8_4_ = auVar86._8_4_ ^ 0x80000000;
  auVar67._12_4_ = auVar86._12_4_ ^ 0x80000000;
  local_158._16_16_ = auVar67;
  local_158._0_16_ = auVar67;
  local_348 = vpshufd_avx(ZEXT416(uVar57),0);
  local_358 = vpshufd_avx(ZEXT416(*(uint *)(prim + lVar59 * 4 + 6)),0);
  uVar58 = 0;
  fVar149 = *(float *)(ray + k * 4 + 0x30);
  _local_238 = vsubps_avx(auVar12,auVar11);
  _local_248 = vsubps_avx(auVar13,auVar12);
  _local_258 = vsubps_avx(_local_388,auVar13);
  _local_2f8 = vsubps_avx(_local_3a8,_local_398);
  _local_308 = vsubps_avx(_local_3f8,_local_3d8);
  _local_318 = vsubps_avx(_local_2e8,_local_3e8);
  _local_328 = vsubps_avx(_local_3c8,_local_3b8);
  _local_5d8 = ZEXT816(0x3f80000000000000);
  auVar86 = _local_5d8;
  do {
    auVar157 = vshufps_avx(_local_5d8,_local_5d8,0x50);
    auVar294._8_4_ = 0x3f800000;
    auVar294._0_8_ = &DAT_3f8000003f800000;
    auVar294._12_4_ = 0x3f800000;
    auVar297._16_4_ = 0x3f800000;
    auVar297._0_16_ = auVar294;
    auVar297._20_4_ = 0x3f800000;
    auVar297._24_4_ = 0x3f800000;
    auVar297._28_4_ = 0x3f800000;
    auVar166 = vsubps_avx(auVar294,auVar157);
    fVar168 = auVar157._0_4_;
    fVar131 = auVar157._4_4_;
    fVar169 = auVar157._8_4_;
    fVar132 = auVar157._12_4_;
    fVar170 = auVar166._0_4_;
    fVar133 = auVar166._4_4_;
    fVar171 = auVar166._8_4_;
    fVar184 = auVar166._12_4_;
    auVar105._0_4_ = auVar237._0_4_ * fVar168 + fVar170 * fVar63;
    auVar105._4_4_ = auVar237._4_4_ * fVar131 + fVar133 * fVar75;
    auVar105._8_4_ = auVar237._0_4_ * fVar169 + fVar171 * fVar63;
    auVar105._12_4_ = auVar237._4_4_ * fVar132 + fVar184 * fVar75;
    auVar81._0_4_ = auVar223._0_4_ * fVar168 + fVar64 * fVar170;
    auVar81._4_4_ = auVar223._4_4_ * fVar131 + fVar76 * fVar133;
    auVar81._8_4_ = auVar223._0_4_ * fVar169 + fVar64 * fVar171;
    auVar81._12_4_ = auVar223._4_4_ * fVar132 + fVar76 * fVar184;
    auVar195._0_4_ = auVar80._0_4_ * fVar168 + auVar273._0_4_ * fVar170;
    auVar195._4_4_ = auVar80._4_4_ * fVar131 + auVar273._4_4_ * fVar133;
    auVar195._8_4_ = auVar80._0_4_ * fVar169 + auVar273._0_4_ * fVar171;
    auVar195._12_4_ = auVar80._4_4_ * fVar132 + auVar273._4_4_ * fVar184;
    auVar118._0_4_ = auVar66._0_4_ * fVar168 + local_378._0_4_ * fVar170;
    auVar118._4_4_ = auVar66._4_4_ * fVar131 + local_378._4_4_ * fVar133;
    auVar118._8_4_ = auVar66._0_4_ * fVar169 + local_378._8_4_ * fVar171;
    auVar118._12_4_ = auVar66._4_4_ * fVar132 + local_378._12_4_ * fVar184;
    auVar157 = vmovshdup_avx(auVar86);
    auVar166 = vshufps_avx(auVar86,auVar86,0);
    auVar213._16_16_ = auVar166;
    auVar213._0_16_ = auVar166;
    auVar65 = vshufps_avx(auVar86,auVar86,0x55);
    auVar72._16_16_ = auVar65;
    auVar72._0_16_ = auVar65;
    auVar71 = vsubps_avx(auVar72,auVar213);
    auVar65 = vshufps_avx(auVar105,auVar105,0);
    auVar85 = vshufps_avx(auVar105,auVar105,0x55);
    auVar77 = vshufps_avx(auVar81,auVar81,0);
    auVar68 = vshufps_avx(auVar81,auVar81,0x55);
    auVar106 = vshufps_avx(auVar195,auVar195,0);
    auVar99 = vshufps_avx(auVar195,auVar195,0x55);
    auVar98 = vshufps_avx(auVar118,auVar118,0);
    auVar100 = vshufps_avx(auVar118,auVar118,0x55);
    auVar157 = ZEXT416((uint)((auVar157._0_4_ - auVar86._0_4_) * 0.04761905));
    auVar157 = vshufps_avx(auVar157,auVar157,0);
    auVar233._0_4_ = auVar166._0_4_ + auVar71._0_4_ * 0.0;
    auVar233._4_4_ = auVar166._4_4_ + auVar71._4_4_ * 0.14285715;
    auVar233._8_4_ = auVar166._8_4_ + auVar71._8_4_ * 0.2857143;
    auVar233._12_4_ = auVar166._12_4_ + auVar71._12_4_ * 0.42857146;
    auVar233._16_4_ = auVar166._0_4_ + auVar71._16_4_ * 0.5714286;
    auVar233._20_4_ = auVar166._4_4_ + auVar71._20_4_ * 0.71428573;
    auVar233._24_4_ = auVar166._8_4_ + auVar71._24_4_ * 0.8571429;
    auVar233._28_4_ = auVar166._12_4_ + auVar71._28_4_;
    auVar16 = vsubps_avx(auVar297,auVar233);
    fVar217 = auVar77._0_4_;
    fVar243 = auVar77._4_4_;
    fVar254 = auVar77._8_4_;
    fVar256 = auVar77._12_4_;
    fVar168 = auVar16._0_4_;
    fVar170 = auVar16._4_4_;
    fVar185 = auVar16._8_4_;
    fVar216 = auVar16._12_4_;
    fVar281 = auVar65._12_4_;
    fVar244 = auVar16._16_4_;
    fVar245 = auVar16._20_4_;
    fVar246 = auVar16._24_4_;
    fVar278 = auVar68._0_4_;
    fVar280 = auVar68._4_4_;
    fVar288 = auVar68._8_4_;
    fVar270 = auVar68._12_4_;
    local_578._0_4_ = auVar85._0_4_;
    local_578._4_4_ = auVar85._4_4_;
    fStack_570 = auVar85._8_4_;
    fStack_56c = auVar85._12_4_;
    fVar131 = auVar106._0_4_;
    fVar132 = auVar106._4_4_;
    fVar171 = auVar106._8_4_;
    fVar186 = auVar106._12_4_;
    fVar234 = auVar233._0_4_ * fVar131 + fVar217 * fVar168;
    fVar253 = auVar233._4_4_ * fVar132 + fVar243 * fVar170;
    fVar255 = auVar233._8_4_ * fVar171 + fVar254 * fVar185;
    fVar261 = auVar233._12_4_ * fVar186 + fVar256 * fVar216;
    fVar262 = auVar233._16_4_ * fVar131 + fVar217 * fVar244;
    fVar263 = auVar233._20_4_ * fVar132 + fVar243 * fVar245;
    fVar271 = auVar233._24_4_ * fVar171 + fVar254 * fVar246;
    fVar169 = auVar99._0_4_;
    fVar133 = auVar99._4_4_;
    fVar184 = auVar99._8_4_;
    fVar200 = auVar99._12_4_;
    fVar279 = auVar233._0_4_ * fVar169 + fVar278 * fVar168;
    fVar283 = auVar233._4_4_ * fVar133 + fVar280 * fVar170;
    fVar290 = auVar233._8_4_ * fVar184 + fVar288 * fVar185;
    fVar292 = auVar233._12_4_ * fVar200 + fVar270 * fVar216;
    fVar264 = auVar233._16_4_ * fVar169 + fVar278 * fVar244;
    fVar266 = auVar233._20_4_ * fVar133 + fVar280 * fVar245;
    fVar268 = auVar233._24_4_ * fVar184 + fVar288 * fVar246;
    auVar166 = vshufps_avx(auVar105,auVar105,0xaa);
    auVar85 = vshufps_avx(auVar105,auVar105,0xff);
    fVar215 = fVar186 + 0.0;
    auVar77 = vshufps_avx(auVar81,auVar81,0xaa);
    auVar68 = vshufps_avx(auVar81,auVar81,0xff);
    auVar73._0_4_ =
         fVar168 * (fVar217 * auVar233._0_4_ + auVar65._0_4_ * fVar168) + auVar233._0_4_ * fVar234;
    auVar73._4_4_ =
         fVar170 * (fVar243 * auVar233._4_4_ + auVar65._4_4_ * fVar170) + auVar233._4_4_ * fVar253;
    auVar73._8_4_ =
         fVar185 * (fVar254 * auVar233._8_4_ + auVar65._8_4_ * fVar185) + auVar233._8_4_ * fVar255;
    auVar73._12_4_ =
         fVar216 * (fVar256 * auVar233._12_4_ + fVar281 * fVar216) + auVar233._12_4_ * fVar261;
    auVar73._16_4_ =
         fVar244 * (fVar217 * auVar233._16_4_ + auVar65._0_4_ * fVar244) + auVar233._16_4_ * fVar262
    ;
    auVar73._20_4_ =
         fVar245 * (fVar243 * auVar233._20_4_ + auVar65._4_4_ * fVar245) + auVar233._20_4_ * fVar263
    ;
    auVar73._24_4_ =
         fVar246 * (fVar254 * auVar233._24_4_ + auVar65._8_4_ * fVar246) + auVar233._24_4_ * fVar271
    ;
    auVar73._28_4_ = fVar281 + 1.0 + fVar200;
    auVar127._0_4_ =
         fVar168 * (fVar278 * auVar233._0_4_ + fVar168 * (float)local_578._0_4_) +
         auVar233._0_4_ * fVar279;
    auVar127._4_4_ =
         fVar170 * (fVar280 * auVar233._4_4_ + fVar170 * (float)local_578._4_4_) +
         auVar233._4_4_ * fVar283;
    auVar127._8_4_ =
         fVar185 * (fVar288 * auVar233._8_4_ + fVar185 * fStack_570) + auVar233._8_4_ * fVar290;
    auVar127._12_4_ =
         fVar216 * (fVar270 * auVar233._12_4_ + fVar216 * fStack_56c) + auVar233._12_4_ * fVar292;
    auVar127._16_4_ =
         fVar244 * (fVar278 * auVar233._16_4_ + fVar244 * (float)local_578._0_4_) +
         auVar233._16_4_ * fVar264;
    auVar127._20_4_ =
         fVar245 * (fVar280 * auVar233._20_4_ + fVar245 * (float)local_578._4_4_) +
         auVar233._20_4_ * fVar266;
    auVar127._24_4_ =
         fVar246 * (fVar288 * auVar233._24_4_ + fVar246 * fStack_570) + auVar233._24_4_ * fVar268;
    auVar127._28_4_ = fVar281 + 1.0 + fVar200;
    auVar146._0_4_ =
         fVar168 * fVar234 + auVar233._0_4_ * (auVar98._0_4_ * auVar233._0_4_ + fVar168 * fVar131);
    auVar146._4_4_ =
         fVar170 * fVar253 + auVar233._4_4_ * (auVar98._4_4_ * auVar233._4_4_ + fVar170 * fVar132);
    auVar146._8_4_ =
         fVar185 * fVar255 + auVar233._8_4_ * (auVar98._8_4_ * auVar233._8_4_ + fVar185 * fVar171);
    auVar146._12_4_ =
         fVar216 * fVar261 +
         auVar233._12_4_ * (auVar98._12_4_ * auVar233._12_4_ + fVar216 * fVar186);
    auVar146._16_4_ =
         fVar244 * fVar262 + auVar233._16_4_ * (auVar98._0_4_ * auVar233._16_4_ + fVar244 * fVar131)
    ;
    auVar146._20_4_ =
         fVar245 * fVar263 + auVar233._20_4_ * (auVar98._4_4_ * auVar233._20_4_ + fVar245 * fVar132)
    ;
    auVar146._24_4_ =
         fVar246 * fVar271 + auVar233._24_4_ * (auVar98._8_4_ * auVar233._24_4_ + fVar246 * fVar171)
    ;
    auVar146._28_4_ = fVar200 + fVar215;
    auVar242._0_4_ =
         fVar168 * fVar279 + auVar233._0_4_ * (auVar100._0_4_ * auVar233._0_4_ + fVar168 * fVar169);
    auVar242._4_4_ =
         fVar170 * fVar283 + auVar233._4_4_ * (auVar100._4_4_ * auVar233._4_4_ + fVar170 * fVar133);
    auVar242._8_4_ =
         fVar185 * fVar290 + auVar233._8_4_ * (auVar100._8_4_ * auVar233._8_4_ + fVar185 * fVar184);
    auVar242._12_4_ =
         fVar216 * fVar292 +
         auVar233._12_4_ * (auVar100._12_4_ * auVar233._12_4_ + fVar216 * fVar200);
    auVar242._16_4_ =
         fVar244 * fVar264 +
         auVar233._16_4_ * (auVar100._0_4_ * auVar233._16_4_ + fVar244 * fVar169);
    auVar242._20_4_ =
         fVar245 * fVar266 +
         auVar233._20_4_ * (auVar100._4_4_ * auVar233._20_4_ + fVar245 * fVar133);
    auVar242._24_4_ =
         fVar246 * fVar268 +
         auVar233._24_4_ * (auVar100._8_4_ * auVar233._24_4_ + fVar246 * fVar184);
    auVar242._28_4_ = fVar215 + fVar200 + 0.0;
    local_78._0_4_ = fVar168 * auVar73._0_4_ + auVar233._0_4_ * auVar146._0_4_;
    local_78._4_4_ = fVar170 * auVar73._4_4_ + auVar233._4_4_ * auVar146._4_4_;
    local_78._8_4_ = fVar185 * auVar73._8_4_ + auVar233._8_4_ * auVar146._8_4_;
    local_78._12_4_ = fVar216 * auVar73._12_4_ + auVar233._12_4_ * auVar146._12_4_;
    local_78._16_4_ = fVar244 * auVar73._16_4_ + auVar233._16_4_ * auVar146._16_4_;
    local_78._20_4_ = fVar245 * auVar73._20_4_ + auVar233._20_4_ * auVar146._20_4_;
    local_78._24_4_ = fVar246 * auVar73._24_4_ + auVar233._24_4_ * auVar146._24_4_;
    local_78._28_4_ = fVar281 + fVar256 + fVar200 + 0.0;
    local_98._0_4_ = fVar168 * auVar127._0_4_ + auVar233._0_4_ * auVar242._0_4_;
    local_98._4_4_ = fVar170 * auVar127._4_4_ + auVar233._4_4_ * auVar242._4_4_;
    local_98._8_4_ = fVar185 * auVar127._8_4_ + auVar233._8_4_ * auVar242._8_4_;
    local_98._12_4_ = fVar216 * auVar127._12_4_ + auVar233._12_4_ * auVar242._12_4_;
    local_98._16_4_ = fVar244 * auVar127._16_4_ + auVar233._16_4_ * auVar242._16_4_;
    local_98._20_4_ = fVar245 * auVar127._20_4_ + auVar233._20_4_ * auVar242._20_4_;
    local_98._24_4_ = fVar246 * auVar127._24_4_ + auVar233._24_4_ * auVar242._24_4_;
    local_98._28_4_ = fVar281 + fVar256 + fVar215;
    auVar17 = vsubps_avx(auVar146,auVar73);
    auVar71 = vsubps_avx(auVar242,auVar127);
    local_5b8 = auVar157._0_4_;
    fStack_5b4 = auVar157._4_4_;
    fStack_5b0 = auVar157._8_4_;
    fStack_5ac = auVar157._12_4_;
    local_d8 = local_5b8 * auVar17._0_4_ * 3.0;
    fStack_d4 = fStack_5b4 * auVar17._4_4_ * 3.0;
    auVar18._4_4_ = fStack_d4;
    auVar18._0_4_ = local_d8;
    fStack_d0 = fStack_5b0 * auVar17._8_4_ * 3.0;
    auVar18._8_4_ = fStack_d0;
    fStack_cc = fStack_5ac * auVar17._12_4_ * 3.0;
    auVar18._12_4_ = fStack_cc;
    fStack_c8 = local_5b8 * auVar17._16_4_ * 3.0;
    auVar18._16_4_ = fStack_c8;
    fStack_c4 = fStack_5b4 * auVar17._20_4_ * 3.0;
    auVar18._20_4_ = fStack_c4;
    fStack_c0 = fStack_5b0 * auVar17._24_4_ * 3.0;
    auVar18._24_4_ = fStack_c0;
    auVar18._28_4_ = auVar17._28_4_;
    fVar253 = local_5b8 * auVar71._0_4_ * 3.0;
    fVar254 = fStack_5b4 * auVar71._4_4_ * 3.0;
    auVar19._4_4_ = fVar254;
    auVar19._0_4_ = fVar253;
    fVar255 = fStack_5b0 * auVar71._8_4_ * 3.0;
    auVar19._8_4_ = fVar255;
    fVar256 = fStack_5ac * auVar71._12_4_ * 3.0;
    auVar19._12_4_ = fVar256;
    fVar261 = local_5b8 * auVar71._16_4_ * 3.0;
    auVar19._16_4_ = fVar261;
    fVar262 = fStack_5b4 * auVar71._20_4_ * 3.0;
    auVar19._20_4_ = fVar262;
    fVar263 = fStack_5b0 * auVar71._24_4_ * 3.0;
    auVar19._24_4_ = fVar263;
    auVar19._28_4_ = auVar146._28_4_;
    auVar18 = vsubps_avx(local_78,auVar18);
    auVar71 = vperm2f128_avx(auVar18,auVar18,1);
    auVar71 = vshufps_avx(auVar71,auVar18,0x30);
    auVar71 = vshufps_avx(auVar18,auVar71,0x29);
    auVar19 = vsubps_avx(local_98,auVar19);
    auVar18 = vperm2f128_avx(auVar19,auVar19,1);
    auVar18 = vshufps_avx(auVar18,auVar19,0x30);
    auVar72 = vshufps_avx(auVar19,auVar18,0x29);
    fVar284 = auVar77._0_4_;
    fVar289 = auVar77._4_4_;
    fVar291 = auVar77._8_4_;
    fVar131 = auVar68._0_4_;
    fVar133 = auVar68._4_4_;
    fVar186 = auVar68._8_4_;
    fVar217 = auVar68._12_4_;
    fVar282 = auVar85._12_4_;
    auVar157 = vshufps_avx(auVar195,auVar195,0xaa);
    fVar169 = auVar157._0_4_;
    fVar171 = auVar157._4_4_;
    fVar200 = auVar157._8_4_;
    fVar234 = auVar157._12_4_;
    fVar292 = auVar233._0_4_ * fVar169 + fVar284 * fVar168;
    fVar264 = auVar233._4_4_ * fVar171 + fVar289 * fVar170;
    fVar266 = auVar233._8_4_ * fVar200 + fVar291 * fVar185;
    fVar268 = auVar233._12_4_ * fVar234 + auVar77._12_4_ * fVar216;
    fVar265 = auVar233._16_4_ * fVar169 + fVar284 * fVar244;
    fVar267 = auVar233._20_4_ * fVar171 + fVar289 * fVar245;
    fVar269 = auVar233._24_4_ * fVar200 + fVar291 * fVar246;
    fVar270 = fVar282 + fVar281 + fVar270;
    auVar157 = vshufps_avx(auVar195,auVar195,0xff);
    fVar132 = auVar157._0_4_;
    fVar184 = auVar157._4_4_;
    fVar215 = auVar157._8_4_;
    fVar243 = auVar157._12_4_;
    fVar271 = auVar233._0_4_ * fVar132 + fVar168 * fVar131;
    fVar278 = auVar233._4_4_ * fVar184 + fVar170 * fVar133;
    fVar279 = auVar233._8_4_ * fVar215 + fVar185 * fVar186;
    fVar280 = auVar233._12_4_ * fVar243 + fVar216 * fVar217;
    fVar283 = auVar233._16_4_ * fVar132 + fVar244 * fVar131;
    fVar288 = auVar233._20_4_ * fVar184 + fVar245 * fVar133;
    fVar290 = auVar233._24_4_ * fVar215 + fVar246 * fVar186;
    auVar157 = vshufps_avx(auVar118,auVar118,0xaa);
    auVar65 = vshufps_avx(auVar118,auVar118,0xff);
    fVar281 = auVar65._12_4_;
    auVar74._0_4_ =
         auVar233._0_4_ * fVar292 + fVar168 * (fVar284 * auVar233._0_4_ + auVar166._0_4_ * fVar168);
    auVar74._4_4_ =
         auVar233._4_4_ * fVar264 + fVar170 * (fVar289 * auVar233._4_4_ + auVar166._4_4_ * fVar170);
    auVar74._8_4_ =
         auVar233._8_4_ * fVar266 + fVar185 * (fVar291 * auVar233._8_4_ + auVar166._8_4_ * fVar185);
    auVar74._12_4_ =
         auVar233._12_4_ * fVar268 +
         fVar216 * (auVar77._12_4_ * auVar233._12_4_ + auVar166._12_4_ * fVar216);
    auVar74._16_4_ =
         auVar233._16_4_ * fVar265 +
         fVar244 * (fVar284 * auVar233._16_4_ + auVar166._0_4_ * fVar244);
    auVar74._20_4_ =
         auVar233._20_4_ * fVar267 +
         fVar245 * (fVar289 * auVar233._20_4_ + auVar166._4_4_ * fVar245);
    auVar74._24_4_ =
         auVar233._24_4_ * fVar269 +
         fVar246 * (fVar291 * auVar233._24_4_ + auVar166._8_4_ * fVar246);
    auVar74._28_4_ = fVar281 + auVar19._28_4_ + auVar18._28_4_;
    auVar277._0_4_ =
         auVar233._0_4_ * fVar271 + fVar168 * (auVar233._0_4_ * fVar131 + auVar85._0_4_ * fVar168);
    auVar277._4_4_ =
         auVar233._4_4_ * fVar278 + fVar170 * (auVar233._4_4_ * fVar133 + auVar85._4_4_ * fVar170);
    auVar277._8_4_ =
         auVar233._8_4_ * fVar279 + fVar185 * (auVar233._8_4_ * fVar186 + auVar85._8_4_ * fVar185);
    auVar277._12_4_ =
         auVar233._12_4_ * fVar280 + fVar216 * (auVar233._12_4_ * fVar217 + fVar282 * fVar216);
    auVar277._16_4_ =
         auVar233._16_4_ * fVar283 + fVar244 * (auVar233._16_4_ * fVar131 + auVar85._0_4_ * fVar244)
    ;
    auVar277._20_4_ =
         auVar233._20_4_ * fVar288 + fVar245 * (auVar233._20_4_ * fVar133 + auVar85._4_4_ * fVar245)
    ;
    auVar277._24_4_ =
         auVar233._24_4_ * fVar290 + fVar246 * (auVar233._24_4_ * fVar186 + auVar85._8_4_ * fVar246)
    ;
    auVar277._28_4_ = fVar281 + auVar18._28_4_ + auVar146._28_4_;
    auVar18 = vperm2f128_avx(local_78,local_78,1);
    auVar18 = vshufps_avx(auVar18,local_78,0x30);
    auVar73 = vshufps_avx(local_78,auVar18,0x29);
    auVar147._0_4_ =
         fVar168 * fVar292 + auVar233._0_4_ * (auVar157._0_4_ * auVar233._0_4_ + fVar168 * fVar169);
    auVar147._4_4_ =
         fVar170 * fVar264 + auVar233._4_4_ * (auVar157._4_4_ * auVar233._4_4_ + fVar170 * fVar171);
    auVar147._8_4_ =
         fVar185 * fVar266 + auVar233._8_4_ * (auVar157._8_4_ * auVar233._8_4_ + fVar185 * fVar200);
    auVar147._12_4_ =
         fVar216 * fVar268 +
         auVar233._12_4_ * (auVar157._12_4_ * auVar233._12_4_ + fVar216 * fVar234);
    auVar147._16_4_ =
         fVar244 * fVar265 +
         auVar233._16_4_ * (auVar157._0_4_ * auVar233._16_4_ + fVar244 * fVar169);
    auVar147._20_4_ =
         fVar245 * fVar267 +
         auVar233._20_4_ * (auVar157._4_4_ * auVar233._20_4_ + fVar245 * fVar171);
    auVar147._24_4_ =
         fVar246 * fVar269 +
         auVar233._24_4_ * (auVar157._8_4_ * auVar233._24_4_ + fVar246 * fVar200);
    auVar147._28_4_ = fVar270 + auVar157._12_4_ + fVar234;
    auVar183._0_4_ =
         fVar168 * fVar271 + auVar233._0_4_ * (auVar65._0_4_ * auVar233._0_4_ + fVar168 * fVar132);
    auVar183._4_4_ =
         fVar170 * fVar278 + auVar233._4_4_ * (auVar65._4_4_ * auVar233._4_4_ + fVar170 * fVar184);
    auVar183._8_4_ =
         fVar185 * fVar279 + auVar233._8_4_ * (auVar65._8_4_ * auVar233._8_4_ + fVar185 * fVar215);
    auVar183._12_4_ =
         fVar216 * fVar280 + auVar233._12_4_ * (fVar281 * auVar233._12_4_ + fVar216 * fVar243);
    auVar183._16_4_ =
         fVar244 * fVar283 + auVar233._16_4_ * (auVar65._0_4_ * auVar233._16_4_ + fVar244 * fVar132)
    ;
    auVar183._20_4_ =
         fVar245 * fVar288 + auVar233._20_4_ * (auVar65._4_4_ * auVar233._20_4_ + fVar245 * fVar184)
    ;
    auVar183._24_4_ =
         fVar246 * fVar290 + auVar233._24_4_ * (auVar65._8_4_ * auVar233._24_4_ + fVar246 * fVar215)
    ;
    auVar183._28_4_ = fVar282 + fVar217 + fVar281 + fVar243;
    auVar199._0_4_ = fVar168 * auVar74._0_4_ + auVar233._0_4_ * auVar147._0_4_;
    auVar199._4_4_ = fVar170 * auVar74._4_4_ + auVar233._4_4_ * auVar147._4_4_;
    auVar199._8_4_ = fVar185 * auVar74._8_4_ + auVar233._8_4_ * auVar147._8_4_;
    auVar199._12_4_ = fVar216 * auVar74._12_4_ + auVar233._12_4_ * auVar147._12_4_;
    auVar199._16_4_ = fVar244 * auVar74._16_4_ + auVar233._16_4_ * auVar147._16_4_;
    auVar199._20_4_ = fVar245 * auVar74._20_4_ + auVar233._20_4_ * auVar147._20_4_;
    auVar199._24_4_ = fVar246 * auVar74._24_4_ + auVar233._24_4_ * auVar147._24_4_;
    auVar199._28_4_ = fVar270 + fVar281 + fVar243;
    auVar214._0_4_ = fVar168 * auVar277._0_4_ + auVar233._0_4_ * auVar183._0_4_;
    auVar214._4_4_ = fVar170 * auVar277._4_4_ + auVar233._4_4_ * auVar183._4_4_;
    auVar214._8_4_ = fVar185 * auVar277._8_4_ + auVar233._8_4_ * auVar183._8_4_;
    auVar214._12_4_ = fVar216 * auVar277._12_4_ + auVar233._12_4_ * auVar183._12_4_;
    auVar214._16_4_ = fVar244 * auVar277._16_4_ + auVar233._16_4_ * auVar183._16_4_;
    auVar214._20_4_ = fVar245 * auVar277._20_4_ + auVar233._20_4_ * auVar183._20_4_;
    auVar214._24_4_ = fVar246 * auVar277._24_4_ + auVar233._24_4_ * auVar183._24_4_;
    auVar214._28_4_ = auVar16._28_4_ + auVar233._28_4_;
    auVar18 = vsubps_avx(auVar147,auVar74);
    auVar16 = vsubps_avx(auVar183,auVar277);
    local_f8 = local_5b8 * auVar18._0_4_ * 3.0;
    fStack_f4 = fStack_5b4 * auVar18._4_4_ * 3.0;
    auVar14._4_4_ = fStack_f4;
    auVar14._0_4_ = local_f8;
    fStack_f0 = fStack_5b0 * auVar18._8_4_ * 3.0;
    auVar14._8_4_ = fStack_f0;
    fStack_ec = fStack_5ac * auVar18._12_4_ * 3.0;
    auVar14._12_4_ = fStack_ec;
    fStack_e8 = local_5b8 * auVar18._16_4_ * 3.0;
    auVar14._16_4_ = fStack_e8;
    fStack_e4 = fStack_5b4 * auVar18._20_4_ * 3.0;
    auVar14._20_4_ = fStack_e4;
    fStack_e0 = fStack_5b0 * auVar18._24_4_ * 3.0;
    auVar14._24_4_ = fStack_e0;
    auVar14._28_4_ = auVar183._28_4_;
    local_118 = local_5b8 * auVar16._0_4_ * 3.0;
    fStack_114 = fStack_5b4 * auVar16._4_4_ * 3.0;
    auVar15._4_4_ = fStack_114;
    auVar15._0_4_ = local_118;
    fStack_110 = fStack_5b0 * auVar16._8_4_ * 3.0;
    auVar15._8_4_ = fStack_110;
    fStack_10c = fStack_5ac * auVar16._12_4_ * 3.0;
    auVar15._12_4_ = fStack_10c;
    local_5b8 = local_5b8 * auVar16._16_4_ * 3.0;
    auVar15._16_4_ = local_5b8;
    fStack_5b4 = fStack_5b4 * auVar16._20_4_ * 3.0;
    auVar15._20_4_ = fStack_5b4;
    fStack_5b0 = fStack_5b0 * auVar16._24_4_ * 3.0;
    auVar15._24_4_ = fStack_5b0;
    auVar15._28_4_ = fStack_5ac;
    auVar18 = vperm2f128_avx(auVar199,auVar199,1);
    auVar18 = vshufps_avx(auVar18,auVar199,0x30);
    auVar74 = vshufps_avx(auVar199,auVar18,0x29);
    auVar16 = vsubps_avx(auVar199,auVar14);
    auVar18 = vperm2f128_avx(auVar16,auVar16,1);
    auVar18 = vshufps_avx(auVar18,auVar16,0x30);
    auVar14 = vshufps_avx(auVar16,auVar18,0x29);
    auVar16 = vsubps_avx(auVar214,auVar15);
    auVar18 = vperm2f128_avx(auVar16,auVar16,1);
    auVar18 = vshufps_avx(auVar18,auVar16,0x30);
    auVar15 = vshufps_avx(auVar16,auVar18,0x29);
    auVar19 = vsubps_avx(auVar199,local_78);
    auVar20 = vsubps_avx(auVar74,auVar73);
    fVar168 = auVar20._0_4_ + auVar19._0_4_;
    fVar131 = auVar20._4_4_ + auVar19._4_4_;
    fVar169 = auVar20._8_4_ + auVar19._8_4_;
    fVar132 = auVar20._12_4_ + auVar19._12_4_;
    fVar170 = auVar20._16_4_ + auVar19._16_4_;
    fVar133 = auVar20._20_4_ + auVar19._20_4_;
    fVar171 = auVar20._24_4_ + auVar19._24_4_;
    auVar16 = vperm2f128_avx(local_98,local_98,1);
    auVar16 = vshufps_avx(auVar16,local_98,0x30);
    local_b8 = vshufps_avx(local_98,auVar16,0x29);
    auVar16 = vperm2f128_avx(auVar214,auVar214,1);
    auVar16 = vshufps_avx(auVar16,auVar214,0x30);
    auVar127 = vshufps_avx(auVar214,auVar16,0x29);
    auVar16 = vsubps_avx(auVar214,local_98);
    auVar147 = vsubps_avx(auVar127,local_b8);
    fVar184 = auVar16._0_4_ + auVar147._0_4_;
    fVar185 = auVar16._4_4_ + auVar147._4_4_;
    fVar186 = auVar16._8_4_ + auVar147._8_4_;
    fVar200 = auVar16._12_4_ + auVar147._12_4_;
    fVar215 = auVar16._16_4_ + auVar147._16_4_;
    fVar216 = auVar16._20_4_ + auVar147._20_4_;
    fVar217 = auVar16._24_4_ + auVar147._24_4_;
    fVar234 = auVar16._28_4_;
    auVar16._4_4_ = local_98._4_4_ * fVar131;
    auVar16._0_4_ = local_98._0_4_ * fVar168;
    auVar16._8_4_ = local_98._8_4_ * fVar169;
    auVar16._12_4_ = local_98._12_4_ * fVar132;
    auVar16._16_4_ = local_98._16_4_ * fVar170;
    auVar16._20_4_ = local_98._20_4_ * fVar133;
    auVar16._24_4_ = local_98._24_4_ * fVar171;
    auVar16._28_4_ = fVar234;
    auVar21._4_4_ = fVar185 * local_78._4_4_;
    auVar21._0_4_ = fVar184 * local_78._0_4_;
    auVar21._8_4_ = fVar186 * local_78._8_4_;
    auVar21._12_4_ = fVar200 * local_78._12_4_;
    auVar21._16_4_ = fVar215 * local_78._16_4_;
    auVar21._20_4_ = fVar216 * local_78._20_4_;
    auVar21._24_4_ = fVar217 * local_78._24_4_;
    auVar21._28_4_ = auVar18._28_4_;
    auVar16 = vsubps_avx(auVar16,auVar21);
    local_d8 = local_78._0_4_ + local_d8;
    fStack_d4 = local_78._4_4_ + fStack_d4;
    fStack_d0 = local_78._8_4_ + fStack_d0;
    fStack_cc = local_78._12_4_ + fStack_cc;
    fStack_c8 = local_78._16_4_ + fStack_c8;
    fStack_c4 = local_78._20_4_ + fStack_c4;
    fStack_c0 = local_78._24_4_ + fStack_c0;
    fStack_bc = local_78._28_4_ + auVar17._28_4_;
    fVar253 = local_98._0_4_ + fVar253;
    fVar254 = local_98._4_4_ + fVar254;
    fVar255 = local_98._8_4_ + fVar255;
    fVar256 = local_98._12_4_ + fVar256;
    fVar261 = local_98._16_4_ + fVar261;
    fVar262 = local_98._20_4_ + fVar262;
    fVar263 = local_98._24_4_ + fVar263;
    auVar17._4_4_ = fVar254 * fVar131;
    auVar17._0_4_ = fVar253 * fVar168;
    auVar17._8_4_ = fVar255 * fVar169;
    auVar17._12_4_ = fVar256 * fVar132;
    auVar17._16_4_ = fVar261 * fVar170;
    auVar17._20_4_ = fVar262 * fVar133;
    auVar17._24_4_ = fVar263 * fVar171;
    auVar17._28_4_ = fVar234;
    auVar22._4_4_ = fVar185 * fStack_d4;
    auVar22._0_4_ = fVar184 * local_d8;
    auVar22._8_4_ = fVar186 * fStack_d0;
    auVar22._12_4_ = fVar200 * fStack_cc;
    auVar22._16_4_ = fVar215 * fStack_c8;
    auVar22._20_4_ = fVar216 * fStack_c4;
    auVar22._24_4_ = fVar217 * fStack_c0;
    auVar22._28_4_ = fStack_bc;
    auVar17 = vsubps_avx(auVar17,auVar22);
    auVar23._4_4_ = auVar72._4_4_ * fVar131;
    auVar23._0_4_ = auVar72._0_4_ * fVar168;
    auVar23._8_4_ = auVar72._8_4_ * fVar169;
    auVar23._12_4_ = auVar72._12_4_ * fVar132;
    auVar23._16_4_ = auVar72._16_4_ * fVar170;
    auVar23._20_4_ = auVar72._20_4_ * fVar133;
    auVar23._24_4_ = auVar72._24_4_ * fVar171;
    auVar23._28_4_ = fVar234;
    local_578._0_4_ = auVar71._0_4_;
    local_578._4_4_ = auVar71._4_4_;
    fStack_570 = auVar71._8_4_;
    fStack_56c = auVar71._12_4_;
    fStack_568 = auVar71._16_4_;
    fStack_564 = auVar71._20_4_;
    fStack_560 = auVar71._24_4_;
    auVar24._4_4_ = fVar185 * (float)local_578._4_4_;
    auVar24._0_4_ = fVar184 * (float)local_578._0_4_;
    auVar24._8_4_ = fVar186 * fStack_570;
    auVar24._12_4_ = fVar200 * fStack_56c;
    auVar24._16_4_ = fVar215 * fStack_568;
    auVar24._20_4_ = fVar216 * fStack_564;
    auVar24._24_4_ = fVar217 * fStack_560;
    auVar24._28_4_ = 0x40400000;
    auVar21 = vsubps_avx(auVar23,auVar24);
    auVar25._4_4_ = local_b8._4_4_ * fVar131;
    auVar25._0_4_ = local_b8._0_4_ * fVar168;
    auVar25._8_4_ = local_b8._8_4_ * fVar169;
    auVar25._12_4_ = local_b8._12_4_ * fVar132;
    auVar25._16_4_ = local_b8._16_4_ * fVar170;
    auVar25._20_4_ = local_b8._20_4_ * fVar133;
    auVar25._24_4_ = local_b8._24_4_ * fVar171;
    auVar25._28_4_ = fVar234;
    auVar26._4_4_ = auVar73._4_4_ * fVar185;
    auVar26._0_4_ = auVar73._0_4_ * fVar184;
    auVar26._8_4_ = auVar73._8_4_ * fVar186;
    auVar26._12_4_ = auVar73._12_4_ * fVar200;
    auVar26._16_4_ = auVar73._16_4_ * fVar215;
    auVar26._20_4_ = auVar73._20_4_ * fVar216;
    auVar26._24_4_ = auVar73._24_4_ * fVar217;
    auVar26._28_4_ = local_b8._28_4_;
    auVar22 = vsubps_avx(auVar25,auVar26);
    auVar27._4_4_ = auVar214._4_4_ * fVar131;
    auVar27._0_4_ = auVar214._0_4_ * fVar168;
    auVar27._8_4_ = auVar214._8_4_ * fVar169;
    auVar27._12_4_ = auVar214._12_4_ * fVar132;
    auVar27._16_4_ = auVar214._16_4_ * fVar170;
    auVar27._20_4_ = auVar214._20_4_ * fVar133;
    auVar27._24_4_ = auVar214._24_4_ * fVar171;
    auVar27._28_4_ = fVar234;
    auVar28._4_4_ = fVar185 * auVar199._4_4_;
    auVar28._0_4_ = fVar184 * auVar199._0_4_;
    auVar28._8_4_ = fVar186 * auVar199._8_4_;
    auVar28._12_4_ = fVar200 * auVar199._12_4_;
    auVar28._16_4_ = fVar215 * auVar199._16_4_;
    auVar28._20_4_ = fVar216 * auVar199._20_4_;
    auVar28._24_4_ = fVar217 * auVar199._24_4_;
    auVar28._28_4_ = auVar72._28_4_;
    auVar23 = vsubps_avx(auVar27,auVar28);
    local_f8 = auVar199._0_4_ + local_f8;
    fStack_f4 = auVar199._4_4_ + fStack_f4;
    fStack_f0 = auVar199._8_4_ + fStack_f0;
    fStack_ec = auVar199._12_4_ + fStack_ec;
    fStack_e8 = auVar199._16_4_ + fStack_e8;
    fStack_e4 = auVar199._20_4_ + fStack_e4;
    fStack_e0 = auVar199._24_4_ + fStack_e0;
    fStack_dc = auVar199._28_4_ + auVar183._28_4_;
    local_118 = auVar214._0_4_ + local_118;
    fStack_114 = auVar214._4_4_ + fStack_114;
    fStack_110 = auVar214._8_4_ + fStack_110;
    fStack_10c = auVar214._12_4_ + fStack_10c;
    fStack_108 = auVar214._16_4_ + local_5b8;
    fStack_104 = auVar214._20_4_ + fStack_5b4;
    fStack_100 = auVar214._24_4_ + fStack_5b0;
    fStack_fc = auVar214._28_4_ + fStack_5ac;
    auVar29._4_4_ = fStack_114 * fVar131;
    auVar29._0_4_ = local_118 * fVar168;
    auVar29._8_4_ = fStack_110 * fVar169;
    auVar29._12_4_ = fStack_10c * fVar132;
    auVar29._16_4_ = fStack_108 * fVar170;
    auVar29._20_4_ = fStack_104 * fVar133;
    auVar29._24_4_ = fStack_100 * fVar171;
    auVar29._28_4_ = auVar214._28_4_ + fStack_5ac;
    auVar30._4_4_ = fStack_f4 * fVar185;
    auVar30._0_4_ = local_f8 * fVar184;
    auVar30._8_4_ = fStack_f0 * fVar186;
    auVar30._12_4_ = fStack_ec * fVar200;
    auVar30._16_4_ = fStack_e8 * fVar215;
    auVar30._20_4_ = fStack_e4 * fVar216;
    auVar30._24_4_ = fStack_e0 * fVar217;
    auVar30._28_4_ = fStack_dc;
    auVar24 = vsubps_avx(auVar29,auVar30);
    auVar31._4_4_ = auVar15._4_4_ * fVar131;
    auVar31._0_4_ = auVar15._0_4_ * fVar168;
    auVar31._8_4_ = auVar15._8_4_ * fVar169;
    auVar31._12_4_ = auVar15._12_4_ * fVar132;
    auVar31._16_4_ = auVar15._16_4_ * fVar170;
    auVar31._20_4_ = auVar15._20_4_ * fVar133;
    auVar31._24_4_ = auVar15._24_4_ * fVar171;
    auVar31._28_4_ = fStack_dc;
    auVar32._4_4_ = fVar185 * auVar14._4_4_;
    auVar32._0_4_ = fVar184 * auVar14._0_4_;
    auVar32._8_4_ = fVar186 * auVar14._8_4_;
    auVar32._12_4_ = fVar200 * auVar14._12_4_;
    auVar32._16_4_ = fVar215 * auVar14._16_4_;
    auVar32._20_4_ = fVar216 * auVar14._20_4_;
    auVar32._24_4_ = fVar217 * auVar14._24_4_;
    auVar32._28_4_ = auVar14._28_4_;
    auVar25 = vsubps_avx(auVar31,auVar32);
    auVar33._4_4_ = auVar127._4_4_ * fVar131;
    auVar33._0_4_ = auVar127._0_4_ * fVar168;
    auVar33._8_4_ = auVar127._8_4_ * fVar169;
    auVar33._12_4_ = auVar127._12_4_ * fVar132;
    auVar33._16_4_ = auVar127._16_4_ * fVar170;
    auVar33._20_4_ = auVar127._20_4_ * fVar133;
    auVar33._24_4_ = auVar127._24_4_ * fVar171;
    auVar33._28_4_ = auVar20._28_4_ + auVar19._28_4_;
    auVar20._4_4_ = auVar74._4_4_ * fVar185;
    auVar20._0_4_ = auVar74._0_4_ * fVar184;
    auVar20._8_4_ = auVar74._8_4_ * fVar186;
    auVar20._12_4_ = auVar74._12_4_ * fVar200;
    auVar20._16_4_ = auVar74._16_4_ * fVar215;
    auVar20._20_4_ = auVar74._20_4_ * fVar216;
    auVar20._24_4_ = auVar74._24_4_ * fVar217;
    auVar20._28_4_ = fVar234 + auVar147._28_4_;
    auVar20 = vsubps_avx(auVar33,auVar20);
    auVar18 = vminps_avx(auVar16,auVar17);
    auVar71 = vmaxps_avx(auVar16,auVar17);
    auVar16 = vminps_avx(auVar21,auVar22);
    auVar16 = vminps_avx(auVar18,auVar16);
    auVar18 = vmaxps_avx(auVar21,auVar22);
    auVar71 = vmaxps_avx(auVar71,auVar18);
    auVar17 = vminps_avx(auVar23,auVar24);
    auVar18 = vmaxps_avx(auVar23,auVar24);
    auVar19 = vminps_avx(auVar25,auVar20);
    auVar17 = vminps_avx(auVar17,auVar19);
    auVar17 = vminps_avx(auVar16,auVar17);
    auVar16 = vmaxps_avx(auVar25,auVar20);
    auVar18 = vmaxps_avx(auVar18,auVar16);
    auVar18 = vmaxps_avx(auVar71,auVar18);
    auVar71 = vcmpps_avx(auVar17,local_138,2);
    auVar18 = vcmpps_avx(auVar18,local_158,5);
    auVar71 = vandps_avx(auVar18,auVar71);
    auVar18 = local_228 & auVar71;
    uVar56 = 0;
    if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0x7f,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar18 >> 0xbf,0) != '\0') ||
        (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar18[0x1f] < '\0')
    {
      auVar18 = vsubps_avx(auVar73,local_78);
      auVar16 = vsubps_avx(auVar74,auVar199);
      fVar131 = auVar18._0_4_ + auVar16._0_4_;
      fVar169 = auVar18._4_4_ + auVar16._4_4_;
      fVar132 = auVar18._8_4_ + auVar16._8_4_;
      fVar170 = auVar18._12_4_ + auVar16._12_4_;
      fVar133 = auVar18._16_4_ + auVar16._16_4_;
      fVar171 = auVar18._20_4_ + auVar16._20_4_;
      fVar184 = auVar18._24_4_ + auVar16._24_4_;
      auVar17 = vsubps_avx(local_b8,local_98);
      auVar19 = vsubps_avx(auVar127,auVar214);
      fVar185 = auVar17._0_4_ + auVar19._0_4_;
      fVar186 = auVar17._4_4_ + auVar19._4_4_;
      fVar200 = auVar17._8_4_ + auVar19._8_4_;
      fVar215 = auVar17._12_4_ + auVar19._12_4_;
      fVar216 = auVar17._16_4_ + auVar19._16_4_;
      fVar217 = auVar17._20_4_ + auVar19._20_4_;
      fVar234 = auVar17._24_4_ + auVar19._24_4_;
      fVar168 = auVar19._28_4_;
      auVar34._4_4_ = local_98._4_4_ * fVar169;
      auVar34._0_4_ = local_98._0_4_ * fVar131;
      auVar34._8_4_ = local_98._8_4_ * fVar132;
      auVar34._12_4_ = local_98._12_4_ * fVar170;
      auVar34._16_4_ = local_98._16_4_ * fVar133;
      auVar34._20_4_ = local_98._20_4_ * fVar171;
      auVar34._24_4_ = local_98._24_4_ * fVar184;
      auVar34._28_4_ = local_98._28_4_;
      auVar35._4_4_ = local_78._4_4_ * fVar186;
      auVar35._0_4_ = local_78._0_4_ * fVar185;
      auVar35._8_4_ = local_78._8_4_ * fVar200;
      auVar35._12_4_ = local_78._12_4_ * fVar215;
      auVar35._16_4_ = local_78._16_4_ * fVar216;
      auVar35._20_4_ = local_78._20_4_ * fVar217;
      auVar35._24_4_ = local_78._24_4_ * fVar234;
      auVar35._28_4_ = local_78._28_4_;
      auVar19 = vsubps_avx(auVar34,auVar35);
      auVar36._4_4_ = fVar254 * fVar169;
      auVar36._0_4_ = fVar253 * fVar131;
      auVar36._8_4_ = fVar255 * fVar132;
      auVar36._12_4_ = fVar256 * fVar170;
      auVar36._16_4_ = fVar261 * fVar133;
      auVar36._20_4_ = fVar262 * fVar171;
      auVar36._24_4_ = fVar263 * fVar184;
      auVar36._28_4_ = local_98._28_4_;
      auVar37._4_4_ = fVar186 * fStack_d4;
      auVar37._0_4_ = fVar185 * local_d8;
      auVar37._8_4_ = fVar200 * fStack_d0;
      auVar37._12_4_ = fVar215 * fStack_cc;
      auVar37._16_4_ = fVar216 * fStack_c8;
      auVar37._20_4_ = fVar217 * fStack_c4;
      auVar37._24_4_ = fVar234 * fStack_c0;
      auVar37._28_4_ = fVar168;
      auVar20 = vsubps_avx(auVar36,auVar37);
      auVar38._4_4_ = fVar169 * auVar72._4_4_;
      auVar38._0_4_ = fVar131 * auVar72._0_4_;
      auVar38._8_4_ = fVar132 * auVar72._8_4_;
      auVar38._12_4_ = fVar170 * auVar72._12_4_;
      auVar38._16_4_ = fVar133 * auVar72._16_4_;
      auVar38._20_4_ = fVar171 * auVar72._20_4_;
      auVar38._24_4_ = fVar184 * auVar72._24_4_;
      auVar38._28_4_ = fVar168;
      auVar39._4_4_ = fVar186 * (float)local_578._4_4_;
      auVar39._0_4_ = fVar185 * (float)local_578._0_4_;
      auVar39._8_4_ = fVar200 * fStack_570;
      auVar39._12_4_ = fVar215 * fStack_56c;
      auVar39._16_4_ = fVar216 * fStack_568;
      auVar39._20_4_ = fVar217 * fStack_564;
      auVar39._24_4_ = fVar234 * fStack_560;
      auVar39._28_4_ = local_98._28_4_ + auVar146._28_4_;
      auVar72 = vsubps_avx(auVar38,auVar39);
      auVar40._4_4_ = local_b8._4_4_ * fVar169;
      auVar40._0_4_ = local_b8._0_4_ * fVar131;
      auVar40._8_4_ = local_b8._8_4_ * fVar132;
      auVar40._12_4_ = local_b8._12_4_ * fVar170;
      auVar40._16_4_ = local_b8._16_4_ * fVar133;
      auVar40._20_4_ = local_b8._20_4_ * fVar171;
      auVar40._24_4_ = local_b8._24_4_ * fVar184;
      auVar40._28_4_ = local_98._28_4_ + auVar146._28_4_;
      auVar41._4_4_ = auVar73._4_4_ * fVar186;
      auVar41._0_4_ = auVar73._0_4_ * fVar185;
      auVar41._8_4_ = auVar73._8_4_ * fVar200;
      auVar41._12_4_ = auVar73._12_4_ * fVar215;
      auVar41._16_4_ = auVar73._16_4_ * fVar216;
      auVar41._20_4_ = auVar73._20_4_ * fVar217;
      uVar4 = auVar73._28_4_;
      auVar41._24_4_ = auVar73._24_4_ * fVar234;
      auVar41._28_4_ = uVar4;
      auVar73 = vsubps_avx(auVar40,auVar41);
      auVar42._4_4_ = auVar214._4_4_ * fVar169;
      auVar42._0_4_ = auVar214._0_4_ * fVar131;
      auVar42._8_4_ = auVar214._8_4_ * fVar132;
      auVar42._12_4_ = auVar214._12_4_ * fVar170;
      auVar42._16_4_ = auVar214._16_4_ * fVar133;
      auVar42._20_4_ = auVar214._20_4_ * fVar171;
      auVar42._24_4_ = auVar214._24_4_ * fVar184;
      auVar42._28_4_ = auVar214._28_4_;
      auVar43._4_4_ = auVar199._4_4_ * fVar186;
      auVar43._0_4_ = auVar199._0_4_ * fVar185;
      auVar43._8_4_ = auVar199._8_4_ * fVar200;
      auVar43._12_4_ = auVar199._12_4_ * fVar215;
      auVar43._16_4_ = auVar199._16_4_ * fVar216;
      auVar43._20_4_ = auVar199._20_4_ * fVar217;
      auVar43._24_4_ = auVar199._24_4_ * fVar234;
      auVar43._28_4_ = auVar199._28_4_;
      auVar147 = vsubps_avx(auVar42,auVar43);
      auVar44._4_4_ = fVar169 * fStack_114;
      auVar44._0_4_ = fVar131 * local_118;
      auVar44._8_4_ = fVar132 * fStack_110;
      auVar44._12_4_ = fVar170 * fStack_10c;
      auVar44._16_4_ = fVar133 * fStack_108;
      auVar44._20_4_ = fVar171 * fStack_104;
      auVar44._24_4_ = fVar184 * fStack_100;
      auVar44._28_4_ = auVar214._28_4_;
      auVar45._4_4_ = fVar186 * fStack_f4;
      auVar45._0_4_ = fVar185 * local_f8;
      auVar45._8_4_ = fVar200 * fStack_f0;
      auVar45._12_4_ = fVar215 * fStack_ec;
      auVar45._16_4_ = fVar216 * fStack_e8;
      auVar45._20_4_ = fVar217 * fStack_e4;
      auVar45._24_4_ = fVar234 * fStack_e0;
      auVar45._28_4_ = uVar4;
      auVar21 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = fVar169 * auVar15._4_4_;
      auVar46._0_4_ = fVar131 * auVar15._0_4_;
      auVar46._8_4_ = fVar132 * auVar15._8_4_;
      auVar46._12_4_ = fVar170 * auVar15._12_4_;
      auVar46._16_4_ = fVar133 * auVar15._16_4_;
      auVar46._20_4_ = fVar171 * auVar15._20_4_;
      auVar46._24_4_ = fVar184 * auVar15._24_4_;
      auVar46._28_4_ = uVar4;
      auVar47._4_4_ = fVar186 * auVar14._4_4_;
      auVar47._0_4_ = fVar185 * auVar14._0_4_;
      auVar47._8_4_ = fVar200 * auVar14._8_4_;
      auVar47._12_4_ = fVar215 * auVar14._12_4_;
      auVar47._16_4_ = fVar216 * auVar14._16_4_;
      auVar47._20_4_ = fVar217 * auVar14._20_4_;
      auVar47._24_4_ = fVar234 * auVar14._24_4_;
      auVar47._28_4_ = local_b8._28_4_;
      auVar14 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = auVar127._4_4_ * fVar169;
      auVar48._0_4_ = auVar127._0_4_ * fVar131;
      auVar48._8_4_ = auVar127._8_4_ * fVar132;
      auVar48._12_4_ = auVar127._12_4_ * fVar170;
      auVar48._16_4_ = auVar127._16_4_ * fVar133;
      auVar48._20_4_ = auVar127._20_4_ * fVar171;
      auVar48._24_4_ = auVar127._24_4_ * fVar184;
      auVar48._28_4_ = auVar18._28_4_ + auVar16._28_4_;
      auVar49._4_4_ = auVar74._4_4_ * fVar186;
      auVar49._0_4_ = auVar74._0_4_ * fVar185;
      auVar49._8_4_ = auVar74._8_4_ * fVar200;
      auVar49._12_4_ = auVar74._12_4_ * fVar215;
      auVar49._16_4_ = auVar74._16_4_ * fVar216;
      auVar49._20_4_ = auVar74._20_4_ * fVar217;
      auVar49._24_4_ = auVar74._24_4_ * fVar234;
      auVar49._28_4_ = auVar17._28_4_ + fVar168;
      auVar74 = vsubps_avx(auVar48,auVar49);
      auVar16 = vminps_avx(auVar19,auVar20);
      auVar18 = vmaxps_avx(auVar19,auVar20);
      auVar17 = vminps_avx(auVar72,auVar73);
      auVar17 = vminps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(auVar72,auVar73);
      auVar18 = vmaxps_avx(auVar18,auVar16);
      auVar19 = vminps_avx(auVar147,auVar21);
      auVar16 = vmaxps_avx(auVar147,auVar21);
      auVar72 = vminps_avx(auVar14,auVar74);
      auVar19 = vminps_avx(auVar19,auVar72);
      auVar19 = vminps_avx(auVar17,auVar19);
      auVar17 = vmaxps_avx(auVar14,auVar74);
      auVar16 = vmaxps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(auVar18,auVar16);
      auVar18 = vcmpps_avx(auVar19,local_138,2);
      auVar16 = vcmpps_avx(auVar16,local_158,5);
      auVar18 = vandps_avx(auVar16,auVar18);
      auVar71 = vandps_avx(auVar71,local_228);
      auVar16 = auVar71 & auVar18;
      if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar16 >> 0x7f,0) != '\0') ||
            (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar16 >> 0xbf,0) != '\0') ||
          (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar16[0x1f] < '\0') {
        auVar71 = vandps_avx(auVar18,auVar71);
        uVar56 = vmovmskps_avx(auVar71);
      }
    }
    if (uVar56 != 0) {
      auStack_368[uVar58] = uVar56;
      uVar5 = vmovlps_avx(auVar86);
      *(undefined8 *)(afStack_208 + uVar58 * 2) = uVar5;
      uVar61 = vmovlps_avx(_local_5d8);
      auStack_58[uVar58] = uVar61;
      uVar58 = (ulong)((int)uVar58 + 1);
    }
    auVar298 = ZEXT464(0) << 0x20;
    do {
      if ((int)uVar58 == 0) {
        uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar70._4_4_ = uVar4;
        auVar70._0_4_ = uVar4;
        auVar70._8_4_ = uVar4;
        auVar70._12_4_ = uVar4;
        auVar86 = vcmpps_avx(local_338,auVar70,2);
        uVar57 = vmovmskps_avx(auVar86);
        uVar55 = uVar55 & (uint)local_430 & uVar57;
        if (uVar55 == 0) {
          return;
        }
        goto LAB_00f3b2b7;
      }
      uVar60 = (int)uVar58 - 1;
      uVar62 = (ulong)uVar60;
      uVar56 = auStack_368[uVar62];
      fVar168 = afStack_208[uVar62 * 2];
      fVar131 = afStack_208[uVar62 * 2 + 1];
      register0x000015c8 = 0;
      local_5d8 = (undefined1  [8])auStack_58[uVar62];
      uVar61 = 0;
      if (uVar56 != 0) {
        for (; (uVar56 >> uVar61 & 1) == 0; uVar61 = uVar61 + 1) {
        }
      }
      uVar56 = uVar56 - 1 & uVar56;
      auStack_368[uVar62] = uVar56;
      if (uVar56 == 0) {
        uVar58 = (ulong)uVar60;
      }
      auVar158._8_4_ = 0x3f800000;
      auVar158._0_8_ = &DAT_3f8000003f800000;
      auVar158._12_4_ = 0x3f800000;
      fVar132 = (float)(uVar61 + 1) * 0.14285715;
      fVar169 = (1.0 - (float)uVar61 * 0.14285715) * fVar168 + fVar131 * (float)uVar61 * 0.14285715;
      fVar168 = (1.0 - fVar132) * fVar168 + fVar131 * fVar132;
      fVar131 = fVar168 - fVar169;
      if (0.16666667 <= fVar131) break;
      auVar86 = vshufps_avx(_local_5d8,_local_5d8,0x50);
      auVar157 = vsubps_avx(auVar158,auVar86);
      fVar132 = auVar86._0_4_;
      fVar170 = auVar86._4_4_;
      fVar133 = auVar86._8_4_;
      fVar171 = auVar86._12_4_;
      fVar184 = auVar157._0_4_;
      fVar185 = auVar157._4_4_;
      fVar186 = auVar157._8_4_;
      fVar200 = auVar157._12_4_;
      auVar119._0_4_ = auVar237._0_4_ * fVar132 + fVar184 * fVar63;
      auVar119._4_4_ = auVar237._4_4_ * fVar170 + fVar185 * fVar75;
      auVar119._8_4_ = auVar237._0_4_ * fVar133 + fVar186 * fVar63;
      auVar119._12_4_ = auVar237._4_4_ * fVar171 + fVar200 * fVar75;
      auVar138._0_4_ = auVar223._0_4_ * fVar132 + fVar184 * fVar64;
      auVar138._4_4_ = auVar223._4_4_ * fVar170 + fVar185 * fVar76;
      auVar138._8_4_ = auVar223._0_4_ * fVar133 + fVar186 * fVar64;
      auVar138._12_4_ = auVar223._4_4_ * fVar171 + fVar200 * fVar76;
      auVar159._0_4_ = auVar80._0_4_ * fVar132 + auVar273._0_4_ * fVar184;
      auVar159._4_4_ = auVar80._4_4_ * fVar170 + auVar273._4_4_ * fVar185;
      auVar159._8_4_ = auVar80._0_4_ * fVar133 + auVar273._0_4_ * fVar186;
      auVar159._12_4_ = auVar80._4_4_ * fVar171 + auVar273._4_4_ * fVar200;
      auVar82._0_4_ = auVar66._0_4_ * fVar132 + fVar184 * (float)local_378._0_4_;
      auVar82._4_4_ = auVar66._4_4_ * fVar170 + fVar185 * (float)local_378._4_4_;
      auVar82._8_4_ = auVar66._0_4_ * fVar133 + fVar186 * fStack_370;
      auVar82._12_4_ = auVar66._4_4_ * fVar171 + fVar200 * fStack_36c;
      auVar111._16_16_ = auVar119;
      auVar111._0_16_ = auVar119;
      auVar128._16_16_ = auVar138;
      auVar128._0_16_ = auVar138;
      auVar148._16_16_ = auVar159;
      auVar148._0_16_ = auVar159;
      auVar71 = vshufps_avx(ZEXT2032(CONCAT416(fVar168,ZEXT416((uint)fVar169))),
                            ZEXT2032(CONCAT416(fVar168,ZEXT416((uint)fVar169))),0);
      auVar18 = vsubps_avx(auVar128,auVar111);
      fVar132 = auVar71._0_4_;
      fVar170 = auVar71._4_4_;
      fVar133 = auVar71._8_4_;
      fVar171 = auVar71._12_4_;
      fVar184 = auVar71._16_4_;
      fVar185 = auVar71._20_4_;
      fVar186 = auVar71._24_4_;
      auVar112._0_4_ = auVar119._0_4_ + auVar18._0_4_ * fVar132;
      auVar112._4_4_ = auVar119._4_4_ + auVar18._4_4_ * fVar170;
      auVar112._8_4_ = auVar119._8_4_ + auVar18._8_4_ * fVar133;
      auVar112._12_4_ = auVar119._12_4_ + auVar18._12_4_ * fVar171;
      auVar112._16_4_ = auVar119._0_4_ + auVar18._16_4_ * fVar184;
      auVar112._20_4_ = auVar119._4_4_ + auVar18._20_4_ * fVar185;
      auVar112._24_4_ = auVar119._8_4_ + auVar18._24_4_ * fVar186;
      auVar112._28_4_ = auVar119._12_4_ + auVar18._28_4_;
      auVar18 = vsubps_avx(auVar148,auVar128);
      auVar129._0_4_ = auVar138._0_4_ + auVar18._0_4_ * fVar132;
      auVar129._4_4_ = auVar138._4_4_ + auVar18._4_4_ * fVar170;
      auVar129._8_4_ = auVar138._8_4_ + auVar18._8_4_ * fVar133;
      auVar129._12_4_ = auVar138._12_4_ + auVar18._12_4_ * fVar171;
      auVar129._16_4_ = auVar138._0_4_ + auVar18._16_4_ * fVar184;
      auVar129._20_4_ = auVar138._4_4_ + auVar18._20_4_ * fVar185;
      auVar129._24_4_ = auVar138._8_4_ + auVar18._24_4_ * fVar186;
      auVar129._28_4_ = auVar138._12_4_ + auVar18._28_4_;
      auVar86 = vsubps_avx(auVar82,auVar159);
      auVar96._0_4_ = auVar159._0_4_ + auVar86._0_4_ * fVar132;
      auVar96._4_4_ = auVar159._4_4_ + auVar86._4_4_ * fVar170;
      auVar96._8_4_ = auVar159._8_4_ + auVar86._8_4_ * fVar133;
      auVar96._12_4_ = auVar159._12_4_ + auVar86._12_4_ * fVar171;
      auVar96._16_4_ = auVar159._0_4_ + auVar86._0_4_ * fVar184;
      auVar96._20_4_ = auVar159._4_4_ + auVar86._4_4_ * fVar185;
      auVar96._24_4_ = auVar159._8_4_ + auVar86._8_4_ * fVar186;
      auVar96._28_4_ = auVar159._12_4_ + auVar86._12_4_;
      auVar18 = vsubps_avx(auVar129,auVar112);
      auVar113._0_4_ = auVar112._0_4_ + fVar132 * auVar18._0_4_;
      auVar113._4_4_ = auVar112._4_4_ + fVar170 * auVar18._4_4_;
      auVar113._8_4_ = auVar112._8_4_ + fVar133 * auVar18._8_4_;
      auVar113._12_4_ = auVar112._12_4_ + fVar171 * auVar18._12_4_;
      auVar113._16_4_ = auVar112._16_4_ + fVar184 * auVar18._16_4_;
      auVar113._20_4_ = auVar112._20_4_ + fVar185 * auVar18._20_4_;
      auVar113._24_4_ = auVar112._24_4_ + fVar186 * auVar18._24_4_;
      auVar113._28_4_ = auVar112._28_4_ + auVar18._28_4_;
      auVar18 = vsubps_avx(auVar96,auVar129);
      auVar97._0_4_ = auVar129._0_4_ + fVar132 * auVar18._0_4_;
      auVar97._4_4_ = auVar129._4_4_ + fVar170 * auVar18._4_4_;
      auVar97._8_4_ = auVar129._8_4_ + fVar133 * auVar18._8_4_;
      auVar97._12_4_ = auVar129._12_4_ + fVar171 * auVar18._12_4_;
      auVar97._16_4_ = auVar129._16_4_ + fVar184 * auVar18._16_4_;
      auVar97._20_4_ = auVar129._20_4_ + fVar185 * auVar18._20_4_;
      auVar97._24_4_ = auVar129._24_4_ + fVar186 * auVar18._24_4_;
      auVar97._28_4_ = auVar129._28_4_ + auVar18._28_4_;
      auVar18 = vsubps_avx(auVar97,auVar113);
      auVar120._0_4_ = auVar113._0_4_ + fVar132 * auVar18._0_4_;
      auVar120._4_4_ = auVar113._4_4_ + fVar170 * auVar18._4_4_;
      auVar120._8_4_ = auVar113._8_4_ + fVar133 * auVar18._8_4_;
      auVar120._12_4_ = auVar113._12_4_ + fVar171 * auVar18._12_4_;
      auVar130._16_4_ = auVar113._16_4_ + fVar184 * auVar18._16_4_;
      auVar130._0_16_ = auVar120;
      auVar130._20_4_ = auVar113._20_4_ + fVar185 * auVar18._20_4_;
      auVar130._24_4_ = auVar113._24_4_ + fVar186 * auVar18._24_4_;
      auVar130._28_4_ = auVar113._28_4_ + auVar129._28_4_;
      fVar132 = auVar18._4_4_ * 3.0;
      auVar106 = auVar130._16_16_;
      auVar85 = vshufps_avx(ZEXT416((uint)(fVar131 * 0.33333334)),
                            ZEXT416((uint)(fVar131 * 0.33333334)),0);
      auVar224._0_4_ = auVar120._0_4_ + auVar85._0_4_ * auVar18._0_4_ * 3.0;
      auVar224._4_4_ = auVar120._4_4_ + auVar85._4_4_ * fVar132;
      auVar224._8_4_ = auVar120._8_4_ + auVar85._8_4_ * auVar18._8_4_ * 3.0;
      auVar224._12_4_ = auVar120._12_4_ + auVar85._12_4_ * auVar18._12_4_ * 3.0;
      auVar166 = vshufpd_avx(auVar120,auVar120,3);
      auVar65 = vshufpd_avx(auVar106,auVar106,3);
      auVar86 = vsubps_avx(auVar166,auVar120);
      auVar157 = vsubps_avx(auVar65,auVar106);
      auVar83._0_4_ = auVar86._0_4_ + auVar157._0_4_;
      auVar83._4_4_ = auVar86._4_4_ + auVar157._4_4_;
      auVar83._8_4_ = auVar86._8_4_ + auVar157._8_4_;
      auVar83._12_4_ = auVar86._12_4_ + auVar157._12_4_;
      auVar86 = vmovshdup_avx(auVar120);
      auVar157 = vmovshdup_avx(auVar224);
      auVar77 = vshufps_avx(auVar83,auVar83,0);
      auVar68 = vshufps_avx(auVar83,auVar83,0x55);
      fVar185 = auVar68._0_4_;
      fVar186 = auVar68._4_4_;
      fVar200 = auVar68._8_4_;
      fVar215 = auVar68._12_4_;
      fVar170 = auVar77._0_4_;
      fVar133 = auVar77._4_4_;
      fVar171 = auVar77._8_4_;
      fVar184 = auVar77._12_4_;
      auVar207._0_4_ = fVar170 * auVar120._0_4_ + fVar185 * auVar86._0_4_;
      auVar207._4_4_ = fVar133 * auVar120._4_4_ + fVar186 * auVar86._4_4_;
      auVar207._8_4_ = fVar171 * auVar120._8_4_ + fVar200 * auVar86._8_4_;
      auVar207._12_4_ = fVar184 * auVar120._12_4_ + fVar215 * auVar86._12_4_;
      auVar225._0_4_ = auVar224._0_4_ * fVar170 + fVar185 * auVar157._0_4_;
      auVar225._4_4_ = auVar224._4_4_ * fVar133 + fVar186 * auVar157._4_4_;
      auVar225._8_4_ = auVar224._8_4_ * fVar171 + fVar200 * auVar157._8_4_;
      auVar225._12_4_ = auVar224._12_4_ * fVar184 + fVar215 * auVar157._12_4_;
      auVar157 = vshufps_avx(auVar207,auVar207,0xe8);
      auVar77 = vshufps_avx(auVar225,auVar225,0xe8);
      auVar86 = vcmpps_avx(auVar157,auVar77,1);
      uVar56 = vextractps_avx(auVar86,0);
      auVar68 = auVar225;
      if ((uVar56 & 1) == 0) {
        auVar68 = auVar207;
      }
      auVar84._0_4_ = auVar85._0_4_ * auVar18._16_4_ * 3.0;
      auVar84._4_4_ = auVar85._4_4_ * fVar132;
      auVar84._8_4_ = auVar85._8_4_ * auVar18._24_4_ * 3.0;
      auVar84._12_4_ = auVar85._12_4_ * auVar71._28_4_;
      auVar98 = vsubps_avx(auVar106,auVar84);
      auVar85 = vmovshdup_avx(auVar98);
      auVar106 = vmovshdup_avx(auVar106);
      fVar132 = auVar98._0_4_;
      fVar216 = auVar98._4_4_;
      auVar295._0_4_ = fVar170 * fVar132 + fVar185 * auVar85._0_4_;
      auVar295._4_4_ = fVar133 * fVar216 + fVar186 * auVar85._4_4_;
      auVar295._8_4_ = fVar171 * auVar98._8_4_ + fVar200 * auVar85._8_4_;
      auVar295._12_4_ = fVar184 * auVar98._12_4_ + fVar215 * auVar85._12_4_;
      auVar274._0_4_ = fVar170 * auVar130._16_4_ + fVar185 * auVar106._0_4_;
      auVar274._4_4_ = fVar133 * auVar130._20_4_ + fVar186 * auVar106._4_4_;
      auVar274._8_4_ = fVar171 * auVar130._24_4_ + fVar200 * auVar106._8_4_;
      auVar274._12_4_ = fVar184 * auVar130._28_4_ + fVar215 * auVar106._12_4_;
      auVar106 = vshufps_avx(auVar295,auVar295,0xe8);
      auVar99 = vshufps_avx(auVar274,auVar274,0xe8);
      auVar85 = vcmpps_avx(auVar106,auVar99,1);
      uVar56 = vextractps_avx(auVar85,0);
      auVar100 = auVar274;
      if ((uVar56 & 1) == 0) {
        auVar100 = auVar295;
      }
      auVar68 = vmaxss_avx(auVar100,auVar68);
      auVar157 = vminps_avx(auVar157,auVar77);
      auVar77 = vminps_avx(auVar106,auVar99);
      auVar77 = vminps_avx(auVar157,auVar77);
      auVar86 = vshufps_avx(auVar86,auVar86,0x55);
      auVar86 = vblendps_avx(auVar86,auVar85,2);
      auVar85 = vpslld_avx(auVar86,0x1f);
      auVar86 = vshufpd_avx(auVar225,auVar225,1);
      auVar86 = vinsertps_avx(auVar86,auVar274,0x9c);
      auVar157 = vshufpd_avx(auVar207,auVar207,1);
      auVar157 = vinsertps_avx(auVar157,auVar295,0x9c);
      auVar86 = vblendvps_avx(auVar157,auVar86,auVar85);
      auVar157 = vmovshdup_avx(auVar86);
      auVar86 = vmaxss_avx(auVar157,auVar86);
      fVar171 = auVar77._0_4_;
      auVar157 = vmovshdup_avx(auVar77);
      fVar133 = auVar86._0_4_;
      fVar184 = auVar157._0_4_;
      fVar170 = auVar68._0_4_;
      if ((0.0001 <= fVar171) || (fVar133 <= -0.0001)) {
        if ((-0.0001 < fVar170 && fVar184 < 0.0001) ||
           ((fVar171 < 0.0001 && -0.0001 < fVar170 || (fVar184 < 0.0001 && -0.0001 < fVar133))))
        goto LAB_00f3c47e;
LAB_00f3cf08:
        auVar298 = ZEXT1664(ZEXT816(0) << 0x40);
LAB_00f3ced8:
        bVar50 = true;
      }
      else {
LAB_00f3c47e:
        auVar298 = ZEXT464(0) << 0x20;
        auVar85 = vcmpps_avx(auVar77,ZEXT416(0) << 0x20,1);
        auVar157 = vcmpss_avx(auVar68,ZEXT416(0),1);
        auVar285._8_4_ = 0x3f800000;
        auVar285._0_8_ = &DAT_3f8000003f800000;
        auVar285._12_4_ = 0x3f800000;
        auVar160._8_4_ = 0xbf800000;
        auVar160._0_8_ = 0xbf800000bf800000;
        auVar160._12_4_ = 0xbf800000;
        auVar157 = vblendvps_avx(auVar285,auVar160,auVar157);
        auVar85 = vblendvps_avx(auVar285,auVar160,auVar85);
        auVar106 = vcmpss_avx(auVar157,auVar85,4);
        auVar106 = vpshufd_avx(ZEXT416(auVar106._0_4_ & 1),0x50);
        auVar106 = vpslld_avx(auVar106,0x1f);
        auVar106 = vpsrad_avx(auVar106,0x1f);
        auVar106 = vpandn_avx(auVar106,_DAT_02020eb0);
        auVar99 = vmovshdup_avx(auVar85);
        fVar185 = auVar99._0_4_;
        if ((auVar85._0_4_ != fVar185) || (NAN(auVar85._0_4_) || NAN(fVar185))) {
          if ((fVar184 != fVar171) || (NAN(fVar184) || NAN(fVar171))) {
            fVar171 = -fVar171 / (fVar184 - fVar171);
            auVar85 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar171) * 0.0 + fVar171)));
          }
          else {
            auVar85 = vcmpss_avx(auVar77,ZEXT416(0),0);
            auVar85 = vpshufd_avx(ZEXT416(auVar85._0_4_ & 1),0x50);
            auVar85 = vpslld_avx(auVar85,0x1f);
            auVar85 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar85);
          }
          auVar99 = vcmpps_avx(auVar106,auVar85,1);
          auVar77 = vblendps_avx(auVar106,auVar85,2);
          auVar85 = vblendps_avx(auVar85,auVar106,2);
          auVar106 = vblendvps_avx(auVar85,auVar77,auVar99);
        }
        auVar86 = vcmpss_avx(auVar86,ZEXT416(0),1);
        auVar107._8_4_ = 0xbf800000;
        auVar107._0_8_ = 0xbf800000bf800000;
        auVar107._12_4_ = 0xbf800000;
        auVar86 = vblendvps_avx(auVar285,auVar107,auVar86);
        fVar171 = auVar86._0_4_;
        if ((auVar157._0_4_ != fVar171) || (NAN(auVar157._0_4_) || NAN(fVar171))) {
          if ((fVar133 != fVar170) || (NAN(fVar133) || NAN(fVar170))) {
            fVar170 = -fVar170 / (fVar133 - fVar170);
            auVar86 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar170) * 0.0 + fVar170)));
          }
          else {
            auVar86 = vcmpss_avx(auVar68,ZEXT416(0),0);
            auVar86 = vpshufd_avx(ZEXT416(auVar86._0_4_ & 1),0x50);
            auVar86 = vpslld_avx(auVar86,0x1f);
            auVar86 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar86);
          }
          auVar85 = vcmpps_avx(auVar106,auVar86,1);
          auVar157 = vblendps_avx(auVar106,auVar86,2);
          auVar86 = vblendps_avx(auVar86,auVar106,2);
          auVar106 = vblendvps_avx(auVar86,auVar157,auVar85);
        }
        if ((fVar185 != fVar171) || (NAN(fVar185) || NAN(fVar171))) {
          auVar86 = vcmpps_avx(auVar106,auVar285,1);
          auVar157 = vinsertps_avx(auVar106,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar161._4_12_ = auVar106._4_12_;
          auVar161._0_4_ = 0x3f800000;
          auVar106 = vblendvps_avx(auVar161,auVar157,auVar86);
        }
        auVar86 = vcmpps_avx(auVar106,_DAT_01fec6f0,1);
        auVar51._12_4_ = 0;
        auVar51._0_12_ = auVar106._4_12_;
        auVar157 = vinsertps_avx(auVar106,ZEXT416(0x3f800000),0x10);
        auVar86 = vblendvps_avx(auVar157,auVar51 << 0x20,auVar86);
        auVar157 = vmovshdup_avx(auVar86);
        bVar50 = true;
        if (auVar86._0_4_ <= auVar157._0_4_) {
          auVar87._0_4_ = auVar86._0_4_ + -0.1;
          auVar87._4_4_ = auVar86._4_4_ + 0.1;
          auVar87._8_4_ = auVar86._8_4_ + 0.0;
          auVar87._12_4_ = auVar86._12_4_ + 0.0;
          auVar85 = vshufpd_avx(auVar224,auVar224,3);
          auVar121._8_8_ = 0x3f80000000000000;
          auVar121._0_8_ = 0x3f80000000000000;
          auVar86 = vcmpps_avx(auVar87,auVar121,1);
          auVar52._12_4_ = 0;
          auVar52._0_12_ = auVar87._4_12_;
          auVar157 = vinsertps_avx(auVar87,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar86 = vblendvps_avx(auVar157,auVar52 << 0x20,auVar86);
          auVar157 = vshufpd_avx(auVar98,auVar98,3);
          auVar77 = vshufps_avx(auVar86,auVar86,0x50);
          auVar68 = vsubps_avx(auVar285,auVar77);
          local_558 = auVar166._0_4_;
          fStack_554 = auVar166._4_4_;
          fStack_550 = auVar166._8_4_;
          fStack_54c = auVar166._12_4_;
          fVar170 = auVar77._0_4_;
          fVar133 = auVar77._4_4_;
          fVar171 = auVar77._8_4_;
          fVar184 = auVar77._12_4_;
          local_598 = auVar65._0_4_;
          fStack_594 = auVar65._4_4_;
          fStack_590 = auVar65._8_4_;
          fStack_58c = auVar65._12_4_;
          fVar185 = auVar68._0_4_;
          fVar186 = auVar68._4_4_;
          fVar200 = auVar68._8_4_;
          fVar215 = auVar68._12_4_;
          auVar108._0_4_ = fVar170 * local_558 + fVar185 * auVar120._0_4_;
          auVar108._4_4_ = fVar133 * fStack_554 + fVar186 * auVar120._4_4_;
          auVar108._8_4_ = fVar171 * fStack_550 + fVar200 * auVar120._0_4_;
          auVar108._12_4_ = fVar184 * fStack_54c + fVar215 * auVar120._4_4_;
          auVar139._0_4_ = fVar170 * auVar85._0_4_ + fVar185 * auVar224._0_4_;
          auVar139._4_4_ = fVar133 * auVar85._4_4_ + fVar186 * auVar224._4_4_;
          auVar139._8_4_ = fVar171 * auVar85._8_4_ + fVar200 * auVar224._0_4_;
          auVar139._12_4_ = fVar184 * auVar85._12_4_ + fVar215 * auVar224._4_4_;
          auVar196._0_4_ = fVar170 * auVar157._0_4_ + fVar185 * fVar132;
          auVar196._4_4_ = fVar133 * auVar157._4_4_ + fVar186 * fVar216;
          auVar196._8_4_ = fVar171 * auVar157._8_4_ + fVar200 * fVar132;
          auVar196._12_4_ = fVar184 * auVar157._12_4_ + fVar215 * fVar216;
          auVar208._0_4_ = fVar170 * local_598 + fVar185 * auVar130._16_4_;
          auVar208._4_4_ = fVar133 * fStack_594 + fVar186 * auVar130._20_4_;
          auVar208._8_4_ = fVar171 * fStack_590 + fVar200 * auVar130._16_4_;
          auVar208._12_4_ = fVar184 * fStack_58c + fVar215 * auVar130._20_4_;
          auVar65 = vsubps_avx(auVar285,auVar86);
          auVar157 = vmovshdup_avx(_local_5d8);
          auVar166 = vmovsldup_avx(_local_5d8);
          local_5d8._0_4_ = auVar65._0_4_ * auVar166._0_4_ + auVar157._0_4_ * auVar86._0_4_;
          local_5d8._4_4_ = auVar65._4_4_ * auVar166._4_4_ + auVar157._4_4_ * auVar86._4_4_;
          fStack_5d0 = auVar65._8_4_ * auVar166._8_4_ + auVar157._8_4_ * auVar86._8_4_;
          fStack_5cc = auVar65._12_4_ * auVar166._12_4_ + auVar157._12_4_ * auVar86._12_4_;
          auVar98 = vmovshdup_avx(_local_5d8);
          auVar86 = vsubps_avx(auVar139,auVar108);
          auVar162._0_4_ = auVar86._0_4_ * 3.0;
          auVar162._4_4_ = auVar86._4_4_ * 3.0;
          auVar162._8_4_ = auVar86._8_4_ * 3.0;
          auVar162._12_4_ = auVar86._12_4_ * 3.0;
          auVar86 = vsubps_avx(auVar196,auVar139);
          auVar178._0_4_ = auVar86._0_4_ * 3.0;
          auVar178._4_4_ = auVar86._4_4_ * 3.0;
          auVar178._8_4_ = auVar86._8_4_ * 3.0;
          auVar178._12_4_ = auVar86._12_4_ * 3.0;
          auVar86 = vsubps_avx(auVar208,auVar196);
          auVar226._0_4_ = auVar86._0_4_ * 3.0;
          auVar226._4_4_ = auVar86._4_4_ * 3.0;
          auVar226._8_4_ = auVar86._8_4_ * 3.0;
          auVar226._12_4_ = auVar86._12_4_ * 3.0;
          auVar157 = vminps_avx(auVar178,auVar226);
          auVar86 = vmaxps_avx(auVar178,auVar226);
          auVar157 = vminps_avx(auVar162,auVar157);
          auVar86 = vmaxps_avx(auVar162,auVar86);
          auVar166 = vshufpd_avx(auVar157,auVar157,3);
          auVar65 = vshufpd_avx(auVar86,auVar86,3);
          auVar157 = vminps_avx(auVar157,auVar166);
          auVar86 = vmaxps_avx(auVar86,auVar65);
          auVar166 = vshufps_avx(ZEXT416((uint)(1.0 / fVar131)),ZEXT416((uint)(1.0 / fVar131)),0);
          auVar163._0_4_ = auVar166._0_4_ * auVar157._0_4_;
          auVar163._4_4_ = auVar166._4_4_ * auVar157._4_4_;
          auVar163._8_4_ = auVar166._8_4_ * auVar157._8_4_;
          auVar163._12_4_ = auVar166._12_4_ * auVar157._12_4_;
          auVar179._0_4_ = auVar86._0_4_ * auVar166._0_4_;
          auVar179._4_4_ = auVar86._4_4_ * auVar166._4_4_;
          auVar179._8_4_ = auVar86._8_4_ * auVar166._8_4_;
          auVar179._12_4_ = auVar86._12_4_ * auVar166._12_4_;
          auVar68 = ZEXT416((uint)(1.0 / (auVar98._0_4_ - (float)local_5d8._0_4_)));
          auVar86 = vshufpd_avx(auVar108,auVar108,3);
          auVar157 = vshufpd_avx(auVar139,auVar139,3);
          auVar166 = vshufpd_avx(auVar196,auVar196,3);
          auVar65 = vshufpd_avx(auVar208,auVar208,3);
          auVar86 = vsubps_avx(auVar86,auVar108);
          auVar85 = vsubps_avx(auVar157,auVar139);
          auVar77 = vsubps_avx(auVar166,auVar196);
          auVar65 = vsubps_avx(auVar65,auVar208);
          auVar157 = vminps_avx(auVar86,auVar85);
          auVar86 = vmaxps_avx(auVar86,auVar85);
          auVar166 = vminps_avx(auVar77,auVar65);
          auVar166 = vminps_avx(auVar157,auVar166);
          auVar157 = vmaxps_avx(auVar77,auVar65);
          auVar86 = vmaxps_avx(auVar86,auVar157);
          auVar157 = vshufps_avx(auVar68,auVar68,0);
          auVar238._0_4_ = auVar157._0_4_ * auVar166._0_4_;
          auVar238._4_4_ = auVar157._4_4_ * auVar166._4_4_;
          auVar238._8_4_ = auVar157._8_4_ * auVar166._8_4_;
          auVar238._12_4_ = auVar157._12_4_ * auVar166._12_4_;
          auVar248._0_4_ = auVar157._0_4_ * auVar86._0_4_;
          auVar248._4_4_ = auVar157._4_4_ * auVar86._4_4_;
          auVar248._8_4_ = auVar157._8_4_ * auVar86._8_4_;
          auVar248._12_4_ = auVar157._12_4_ * auVar86._12_4_;
          auVar86 = vmovsldup_avx(_local_5d8);
          auVar197._4_12_ = auVar86._4_12_;
          auVar197._0_4_ = fVar169;
          auVar209._4_12_ = local_5d8._4_12_;
          auVar209._0_4_ = fVar168;
          auVar69._0_4_ = (fVar168 + fVar169) * 0.5;
          auVar69._4_4_ = ((float)local_5d8._4_4_ + auVar86._4_4_) * 0.5;
          auVar69._8_4_ = (fStack_5d0 + auVar86._8_4_) * 0.5;
          auVar69._12_4_ = (fStack_5cc + auVar86._12_4_) * 0.5;
          auVar86 = vshufps_avx(auVar69,auVar69,0);
          fVar132 = auVar86._0_4_;
          fVar170 = auVar86._4_4_;
          fVar133 = auVar86._8_4_;
          fVar171 = auVar86._12_4_;
          local_478 = auVar11._0_4_;
          fStack_474 = auVar11._4_4_;
          fStack_470 = auVar11._8_4_;
          fStack_46c = auVar11._12_4_;
          auVar140._0_4_ = fVar132 * (float)local_238._0_4_ + local_478;
          auVar140._4_4_ = fVar170 * (float)local_238._4_4_ + fStack_474;
          auVar140._8_4_ = fVar133 * fStack_230 + fStack_470;
          auVar140._12_4_ = fVar171 * fStack_22c + fStack_46c;
          local_488 = auVar12._0_4_;
          fStack_484 = auVar12._4_4_;
          fStack_480 = auVar12._8_4_;
          fStack_47c = auVar12._12_4_;
          auVar227._0_4_ = fVar132 * (float)local_248._0_4_ + local_488;
          auVar227._4_4_ = fVar170 * (float)local_248._4_4_ + fStack_484;
          auVar227._8_4_ = fVar133 * fStack_240 + fStack_480;
          auVar227._12_4_ = fVar171 * fStack_23c + fStack_47c;
          local_498 = auVar13._0_4_;
          fStack_494 = auVar13._4_4_;
          fStack_490 = auVar13._8_4_;
          fStack_48c = auVar13._12_4_;
          auVar259._0_4_ = fVar132 * (float)local_258._0_4_ + local_498;
          auVar259._4_4_ = fVar170 * (float)local_258._4_4_ + fStack_494;
          auVar259._8_4_ = fVar133 * fStack_250 + fStack_490;
          auVar259._12_4_ = fVar171 * fStack_24c + fStack_48c;
          auVar86 = vsubps_avx(auVar227,auVar140);
          auVar141._0_4_ = auVar86._0_4_ * fVar132 + auVar140._0_4_;
          auVar141._4_4_ = auVar86._4_4_ * fVar170 + auVar140._4_4_;
          auVar141._8_4_ = auVar86._8_4_ * fVar133 + auVar140._8_4_;
          auVar141._12_4_ = auVar86._12_4_ * fVar171 + auVar140._12_4_;
          auVar86 = vsubps_avx(auVar259,auVar227);
          auVar228._0_4_ = auVar227._0_4_ + auVar86._0_4_ * fVar132;
          auVar228._4_4_ = auVar227._4_4_ + auVar86._4_4_ * fVar170;
          auVar228._8_4_ = auVar227._8_4_ + auVar86._8_4_ * fVar133;
          auVar228._12_4_ = auVar227._12_4_ + auVar86._12_4_ * fVar171;
          auVar86 = vsubps_avx(auVar228,auVar141);
          fVar132 = auVar141._0_4_ + auVar86._0_4_ * fVar132;
          fVar170 = auVar141._4_4_ + auVar86._4_4_ * fVar170;
          auVar109._0_8_ = CONCAT44(fVar170,fVar132);
          auVar109._8_4_ = auVar141._8_4_ + auVar86._8_4_ * fVar133;
          auVar109._12_4_ = auVar141._12_4_ + auVar86._12_4_ * fVar171;
          fVar133 = auVar86._0_4_ * 3.0;
          fVar171 = auVar86._4_4_ * 3.0;
          auVar142._0_8_ = CONCAT44(fVar171,fVar133);
          auVar142._8_4_ = auVar86._8_4_ * 3.0;
          auVar142._12_4_ = auVar86._12_4_ * 3.0;
          auVar229._8_8_ = auVar109._0_8_;
          auVar229._0_8_ = auVar109._0_8_;
          auVar86 = vshufpd_avx(auVar109,auVar109,3);
          auVar157 = vshufps_avx(auVar69,auVar69,0x55);
          auVar77 = vsubps_avx(auVar86,auVar229);
          auVar230._0_4_ = auVar157._0_4_ * auVar77._0_4_ + fVar132;
          auVar230._4_4_ = auVar157._4_4_ * auVar77._4_4_ + fVar170;
          auVar230._8_4_ = auVar157._8_4_ * auVar77._8_4_ + fVar132;
          auVar230._12_4_ = auVar157._12_4_ * auVar77._12_4_ + fVar170;
          auVar275._8_8_ = auVar142._0_8_;
          auVar275._0_8_ = auVar142._0_8_;
          auVar86 = vshufpd_avx(auVar142,auVar142,1);
          auVar86 = vsubps_avx(auVar86,auVar275);
          auVar143._0_4_ = fVar133 + auVar157._0_4_ * auVar86._0_4_;
          auVar143._4_4_ = fVar171 + auVar157._4_4_ * auVar86._4_4_;
          auVar143._8_4_ = fVar133 + auVar157._8_4_ * auVar86._8_4_;
          auVar143._12_4_ = fVar171 + auVar157._12_4_ * auVar86._12_4_;
          auVar157 = vmovshdup_avx(auVar143);
          auVar276._0_8_ = auVar157._0_8_ ^ 0x8000000080000000;
          auVar276._8_4_ = auVar157._8_4_ ^ 0x80000000;
          auVar276._12_4_ = auVar157._12_4_ ^ 0x80000000;
          auVar166 = vmovshdup_avx(auVar77);
          auVar86 = vunpcklps_avx(auVar166,auVar276);
          auVar65 = vshufps_avx(auVar86,auVar276,4);
          auVar110._0_8_ = auVar77._0_8_ ^ 0x8000000080000000;
          auVar110._8_4_ = -auVar77._8_4_;
          auVar110._12_4_ = -auVar77._12_4_;
          auVar86 = vmovlhps_avx(auVar110,auVar143);
          auVar85 = vshufps_avx(auVar86,auVar143,8);
          auVar86 = ZEXT416((uint)(auVar166._0_4_ * auVar143._0_4_ - auVar157._0_4_ * auVar77._0_4_)
                           );
          auVar157 = vshufps_avx(auVar86,auVar86,0);
          auVar86 = vdivps_avx(auVar65,auVar157);
          auVar157 = vdivps_avx(auVar85,auVar157);
          auVar85 = vinsertps_avx(auVar163,auVar238,0x1c);
          auVar77 = vinsertps_avx(auVar179,auVar248,0x1c);
          auVar68 = vinsertps_avx(auVar238,auVar163,0x4c);
          auVar106 = vinsertps_avx(auVar248,auVar179,0x4c);
          auVar166 = vmovsldup_avx(auVar86);
          auVar249._0_4_ = auVar166._0_4_ * auVar85._0_4_;
          auVar249._4_4_ = auVar166._4_4_ * auVar85._4_4_;
          auVar249._8_4_ = auVar166._8_4_ * auVar85._8_4_;
          auVar249._12_4_ = auVar166._12_4_ * auVar85._12_4_;
          auVar239._0_4_ = auVar166._0_4_ * auVar77._0_4_;
          auVar239._4_4_ = auVar166._4_4_ * auVar77._4_4_;
          auVar239._8_4_ = auVar166._8_4_ * auVar77._8_4_;
          auVar239._12_4_ = auVar166._12_4_ * auVar77._12_4_;
          auVar65 = vminps_avx(auVar249,auVar239);
          auVar166 = vmaxps_avx(auVar239,auVar249);
          auVar99 = vmovsldup_avx(auVar157);
          auVar296._0_4_ = auVar99._0_4_ * auVar68._0_4_;
          auVar296._4_4_ = auVar99._4_4_ * auVar68._4_4_;
          auVar296._8_4_ = auVar99._8_4_ * auVar68._8_4_;
          auVar296._12_4_ = auVar99._12_4_ * auVar68._12_4_;
          auVar240._0_4_ = auVar99._0_4_ * auVar106._0_4_;
          auVar240._4_4_ = auVar99._4_4_ * auVar106._4_4_;
          auVar240._8_4_ = auVar99._8_4_ * auVar106._8_4_;
          auVar240._12_4_ = auVar99._12_4_ * auVar106._12_4_;
          auVar99 = vminps_avx(auVar296,auVar240);
          auVar88._0_4_ = auVar65._0_4_ + auVar99._0_4_;
          auVar88._4_4_ = auVar65._4_4_ + auVar99._4_4_;
          auVar88._8_4_ = auVar65._8_4_ + auVar99._8_4_;
          auVar88._12_4_ = auVar65._12_4_ + auVar99._12_4_;
          auVar65 = vmaxps_avx(auVar240,auVar296);
          auVar99 = vsubps_avx(auVar197,auVar69);
          auVar100 = vsubps_avx(auVar209,auVar69);
          auVar210._0_4_ = auVar166._0_4_ + auVar65._0_4_;
          auVar210._4_4_ = auVar166._4_4_ + auVar65._4_4_;
          auVar210._8_4_ = auVar166._8_4_ + auVar65._8_4_;
          auVar210._12_4_ = auVar166._12_4_ + auVar65._12_4_;
          auVar250._8_8_ = 0x3f800000;
          auVar250._0_8_ = 0x3f800000;
          auVar166 = vsubps_avx(auVar250,auVar210);
          auVar65 = vsubps_avx(auVar250,auVar88);
          fVar186 = auVar99._0_4_;
          auVar251._0_4_ = fVar186 * auVar166._0_4_;
          fVar200 = auVar99._4_4_;
          auVar251._4_4_ = fVar200 * auVar166._4_4_;
          fVar215 = auVar99._8_4_;
          auVar251._8_4_ = fVar215 * auVar166._8_4_;
          fVar216 = auVar99._12_4_;
          auVar251._12_4_ = fVar216 * auVar166._12_4_;
          fVar133 = auVar100._0_4_;
          auVar211._0_4_ = auVar166._0_4_ * fVar133;
          fVar171 = auVar100._4_4_;
          auVar211._4_4_ = auVar166._4_4_ * fVar171;
          fVar184 = auVar100._8_4_;
          auVar211._8_4_ = auVar166._8_4_ * fVar184;
          fVar185 = auVar100._12_4_;
          auVar211._12_4_ = auVar166._12_4_ * fVar185;
          auVar286._0_4_ = fVar186 * auVar65._0_4_;
          auVar286._4_4_ = fVar200 * auVar65._4_4_;
          auVar286._8_4_ = fVar215 * auVar65._8_4_;
          auVar286._12_4_ = fVar216 * auVar65._12_4_;
          auVar89._0_4_ = fVar133 * auVar65._0_4_;
          auVar89._4_4_ = fVar171 * auVar65._4_4_;
          auVar89._8_4_ = fVar184 * auVar65._8_4_;
          auVar89._12_4_ = fVar185 * auVar65._12_4_;
          auVar166 = vminps_avx(auVar251,auVar286);
          auVar65 = vminps_avx(auVar211,auVar89);
          auVar99 = vminps_avx(auVar166,auVar65);
          auVar166 = vmaxps_avx(auVar286,auVar251);
          auVar65 = vmaxps_avx(auVar89,auVar211);
          auVar100 = vshufps_avx(auVar69,auVar69,0x54);
          auVar65 = vmaxps_avx(auVar65,auVar166);
          auVar101 = vshufps_avx(auVar230,auVar230,0);
          auVar115 = vshufps_avx(auVar230,auVar230,0x55);
          auVar166 = vhaddps_avx(auVar99,auVar99);
          auVar65 = vhaddps_avx(auVar65,auVar65);
          auVar212._0_4_ = auVar101._0_4_ * auVar86._0_4_ + auVar115._0_4_ * auVar157._0_4_;
          auVar212._4_4_ = auVar101._4_4_ * auVar86._4_4_ + auVar115._4_4_ * auVar157._4_4_;
          auVar212._8_4_ = auVar101._8_4_ * auVar86._8_4_ + auVar115._8_4_ * auVar157._8_4_;
          auVar212._12_4_ = auVar101._12_4_ * auVar86._12_4_ + auVar115._12_4_ * auVar157._12_4_;
          auVar99 = vsubps_avx(auVar100,auVar212);
          fVar132 = auVar99._0_4_ + auVar166._0_4_;
          fVar170 = auVar99._0_4_ + auVar65._0_4_;
          auVar166 = vmaxss_avx(ZEXT416((uint)fVar169),ZEXT416((uint)fVar132));
          auVar65 = vminss_avx(ZEXT416((uint)fVar170),ZEXT416((uint)fVar168));
          if (auVar166._0_4_ <= auVar65._0_4_) {
            auVar166 = vmovshdup_avx(auVar86);
            auVar122._0_4_ = auVar85._0_4_ * auVar166._0_4_;
            auVar122._4_4_ = auVar85._4_4_ * auVar166._4_4_;
            auVar122._8_4_ = auVar85._8_4_ * auVar166._8_4_;
            auVar122._12_4_ = auVar85._12_4_ * auVar166._12_4_;
            auVar90._0_4_ = auVar77._0_4_ * auVar166._0_4_;
            auVar90._4_4_ = auVar77._4_4_ * auVar166._4_4_;
            auVar90._8_4_ = auVar77._8_4_ * auVar166._8_4_;
            auVar90._12_4_ = auVar77._12_4_ * auVar166._12_4_;
            auVar65 = vminps_avx(auVar122,auVar90);
            auVar166 = vmaxps_avx(auVar90,auVar122);
            auVar85 = vmovshdup_avx(auVar157);
            auVar164._0_4_ = auVar85._0_4_ * auVar68._0_4_;
            auVar164._4_4_ = auVar85._4_4_ * auVar68._4_4_;
            auVar164._8_4_ = auVar85._8_4_ * auVar68._8_4_;
            auVar164._12_4_ = auVar85._12_4_ * auVar68._12_4_;
            auVar123._0_4_ = auVar85._0_4_ * auVar106._0_4_;
            auVar123._4_4_ = auVar85._4_4_ * auVar106._4_4_;
            auVar123._8_4_ = auVar85._8_4_ * auVar106._8_4_;
            auVar123._12_4_ = auVar85._12_4_ * auVar106._12_4_;
            auVar85 = vminps_avx(auVar164,auVar123);
            auVar180._0_4_ = auVar65._0_4_ + auVar85._0_4_;
            auVar180._4_4_ = auVar65._4_4_ + auVar85._4_4_;
            auVar180._8_4_ = auVar65._8_4_ + auVar85._8_4_;
            auVar180._12_4_ = auVar65._12_4_ + auVar85._12_4_;
            auVar65 = vmaxps_avx(auVar123,auVar164);
            auVar91._0_4_ = auVar166._0_4_ + auVar65._0_4_;
            auVar91._4_4_ = auVar166._4_4_ + auVar65._4_4_;
            auVar91._8_4_ = auVar166._8_4_ + auVar65._8_4_;
            auVar91._12_4_ = auVar166._12_4_ + auVar65._12_4_;
            auVar166 = vsubps_avx(auVar121,auVar91);
            auVar65 = vsubps_avx(auVar121,auVar180);
            auVar165._0_4_ = fVar186 * auVar166._0_4_;
            auVar165._4_4_ = fVar200 * auVar166._4_4_;
            auVar165._8_4_ = fVar215 * auVar166._8_4_;
            auVar165._12_4_ = fVar216 * auVar166._12_4_;
            auVar181._0_4_ = fVar186 * auVar65._0_4_;
            auVar181._4_4_ = fVar200 * auVar65._4_4_;
            auVar181._8_4_ = fVar215 * auVar65._8_4_;
            auVar181._12_4_ = fVar216 * auVar65._12_4_;
            auVar92._0_4_ = fVar133 * auVar166._0_4_;
            auVar92._4_4_ = fVar171 * auVar166._4_4_;
            auVar92._8_4_ = fVar184 * auVar166._8_4_;
            auVar92._12_4_ = fVar185 * auVar166._12_4_;
            auVar124._0_4_ = fVar133 * auVar65._0_4_;
            auVar124._4_4_ = fVar171 * auVar65._4_4_;
            auVar124._8_4_ = fVar184 * auVar65._8_4_;
            auVar124._12_4_ = fVar185 * auVar65._12_4_;
            auVar166 = vminps_avx(auVar165,auVar181);
            auVar65 = vminps_avx(auVar92,auVar124);
            auVar166 = vminps_avx(auVar166,auVar65);
            auVar65 = vmaxps_avx(auVar181,auVar165);
            auVar85 = vmaxps_avx(auVar124,auVar92);
            auVar166 = vhaddps_avx(auVar166,auVar166);
            auVar65 = vmaxps_avx(auVar85,auVar65);
            auVar65 = vhaddps_avx(auVar65,auVar65);
            auVar85 = vmovshdup_avx(auVar99);
            auVar77 = ZEXT416((uint)(auVar85._0_4_ + auVar166._0_4_));
            auVar166 = vmaxss_avx(_local_5d8,auVar77);
            auVar85 = ZEXT416((uint)(auVar85._0_4_ + auVar65._0_4_));
            auVar65 = vminss_avx(auVar85,auVar98);
            auVar287._8_4_ = 0x7fffffff;
            auVar287._0_8_ = 0x7fffffff7fffffff;
            auVar287._12_4_ = 0x7fffffff;
            if (auVar166._0_4_ <= auVar65._0_4_) {
              uVar56 = 0;
              auVar298 = ZEXT864(0) << 0x20;
              if ((fVar169 < fVar132) && (fVar170 < fVar168)) {
                auVar166 = vcmpps_avx(auVar85,auVar98,1);
                auVar65 = vcmpps_avx(_local_5d8,auVar77,1);
                auVar166 = vandps_avx(auVar65,auVar166);
                uVar56 = auVar166._0_4_;
              }
              if (((uint)uVar58 < 4 && 0.001 <= fVar131) && (uVar56 & 1) == 0) {
                bVar50 = false;
              }
              else {
                lVar59 = 200;
                do {
                  fVar132 = auVar99._0_4_;
                  fVar131 = 1.0 - fVar132;
                  auVar166 = ZEXT416((uint)(fVar131 * fVar131 * fVar131));
                  auVar166 = vshufps_avx(auVar166,auVar166,0);
                  auVar65 = ZEXT416((uint)(fVar132 * 3.0 * fVar131 * fVar131));
                  auVar65 = vshufps_avx(auVar65,auVar65,0);
                  auVar85 = ZEXT416((uint)(fVar131 * fVar132 * fVar132 * 3.0));
                  auVar85 = vshufps_avx(auVar85,auVar85,0);
                  auVar77 = ZEXT416((uint)(fVar132 * fVar132 * fVar132));
                  auVar77 = vshufps_avx(auVar77,auVar77,0);
                  fVar131 = local_478 * auVar166._0_4_ +
                            local_488 * auVar65._0_4_ +
                            (float)local_388._0_4_ * auVar77._0_4_ + local_498 * auVar85._0_4_;
                  fVar132 = fStack_474 * auVar166._4_4_ +
                            fStack_484 * auVar65._4_4_ +
                            (float)local_388._4_4_ * auVar77._4_4_ + fStack_494 * auVar85._4_4_;
                  auVar93._0_8_ = CONCAT44(fVar132,fVar131);
                  auVar93._8_4_ =
                       fStack_470 * auVar166._8_4_ +
                       fStack_480 * auVar65._8_4_ +
                       fStack_380 * auVar77._8_4_ + fStack_490 * auVar85._8_4_;
                  auVar93._12_4_ =
                       fStack_46c * auVar166._12_4_ +
                       fStack_47c * auVar65._12_4_ +
                       fStack_37c * auVar77._12_4_ + fStack_48c * auVar85._12_4_;
                  auVar125._8_8_ = auVar93._0_8_;
                  auVar125._0_8_ = auVar93._0_8_;
                  auVar65 = vshufpd_avx(auVar93,auVar93,1);
                  auVar166 = vmovshdup_avx(auVar99);
                  auVar65 = vsubps_avx(auVar65,auVar125);
                  auVar94._0_4_ = auVar166._0_4_ * auVar65._0_4_ + fVar131;
                  auVar94._4_4_ = auVar166._4_4_ * auVar65._4_4_ + fVar132;
                  auVar94._8_4_ = auVar166._8_4_ * auVar65._8_4_ + fVar131;
                  auVar94._12_4_ = auVar166._12_4_ * auVar65._12_4_ + fVar132;
                  auVar166 = vshufps_avx(auVar94,auVar94,0);
                  auVar65 = vshufps_avx(auVar94,auVar94,0x55);
                  auVar126._0_4_ = auVar86._0_4_ * auVar166._0_4_ + auVar157._0_4_ * auVar65._0_4_;
                  auVar126._4_4_ = auVar86._4_4_ * auVar166._4_4_ + auVar157._4_4_ * auVar65._4_4_;
                  auVar126._8_4_ = auVar86._8_4_ * auVar166._8_4_ + auVar157._8_4_ * auVar65._8_4_;
                  auVar126._12_4_ =
                       auVar86._12_4_ * auVar166._12_4_ + auVar157._12_4_ * auVar65._12_4_;
                  auVar99 = vsubps_avx(auVar99,auVar126);
                  auVar166 = vandps_avx(auVar287,auVar94);
                  auVar65 = vshufps_avx(auVar166,auVar166,0xf5);
                  auVar166 = vmaxss_avx(auVar65,auVar166);
                  if (auVar166._0_4_ < fVar114) {
                    fVar131 = auVar99._0_4_;
                    if ((0.0 <= fVar131) && (fVar131 <= 1.0)) {
                      auVar86 = vmovshdup_avx(auVar99);
                      fVar132 = auVar86._0_4_;
                      if ((0.0 <= fVar132) && (fVar132 <= 1.0)) {
                        auVar86 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                                ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                                0x1c);
                        auVar106 = vinsertps_avx(auVar86,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                       m128[2]),0x28);
                        auVar86 = vdpps_avx(auVar106,local_268,0x7f);
                        auVar157 = vdpps_avx(auVar106,local_278,0x7f);
                        auVar166 = vdpps_avx(auVar106,local_288,0x7f);
                        auVar65 = vdpps_avx(auVar106,local_298,0x7f);
                        auVar85 = vdpps_avx(auVar106,local_2a8,0x7f);
                        auVar77 = vdpps_avx(auVar106,local_2b8,0x7f);
                        auVar68 = vdpps_avx(auVar106,local_2c8,0x7f);
                        auVar106 = vdpps_avx(auVar106,local_2d8,0x7f);
                        fVar185 = 1.0 - fVar132;
                        fVar186 = 1.0 - fVar131;
                        fVar170 = auVar99._4_4_;
                        fVar133 = auVar99._8_4_;
                        fVar171 = auVar99._12_4_;
                        fVar184 = fVar186 * fVar131 * fVar131 * 3.0;
                        auVar198._0_4_ = fVar131 * fVar131 * fVar131;
                        auVar198._4_4_ = fVar170 * fVar170 * fVar170;
                        auVar198._8_4_ = fVar133 * fVar133 * fVar133;
                        auVar198._12_4_ = fVar171 * fVar171 * fVar171;
                        fVar133 = fVar186 * fVar186 * fVar131 * 3.0;
                        fVar171 = fVar186 * fVar186 * fVar186;
                        fVar170 = fVar171 * (fVar185 * auVar86._0_4_ + fVar132 * auVar85._0_4_) +
                                  (fVar185 * auVar157._0_4_ + auVar77._0_4_ * fVar132) * fVar133 +
                                  fVar184 * (auVar68._0_4_ * fVar132 + fVar185 * auVar166._0_4_) +
                                  auVar198._0_4_ *
                                  (fVar185 * auVar65._0_4_ + fVar132 * auVar106._0_4_);
                        if (((fVar149 <= fVar170) &&
                            (fVar185 = *(float *)(ray + k * 4 + 0x80), fVar170 <= fVar185)) &&
                           (pGVar7 = (context->scene->geometries).items[uVar57].ptr,
                           (pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
                          local_1a8 = vshufps_avx(auVar99,auVar99,0x55);
                          auVar231._8_4_ = 0x3f800000;
                          auVar231._0_8_ = &DAT_3f8000003f800000;
                          auVar231._12_4_ = 0x3f800000;
                          auVar86 = vsubps_avx(auVar231,local_1a8);
                          fVar200 = local_1a8._0_4_;
                          fVar215 = local_1a8._4_4_;
                          fVar216 = local_1a8._8_4_;
                          fVar217 = local_1a8._12_4_;
                          fVar234 = auVar86._0_4_;
                          fVar243 = auVar86._4_4_;
                          fVar244 = auVar86._8_4_;
                          fVar245 = auVar86._12_4_;
                          auVar241._0_4_ =
                               fVar200 * (float)local_3a8._0_4_ + fVar234 * (float)local_398._0_4_;
                          auVar241._4_4_ =
                               fVar215 * (float)local_3a8._4_4_ + fVar243 * (float)local_398._4_4_;
                          auVar241._8_4_ = fVar216 * fStack_3a0 + fVar244 * fStack_390;
                          auVar241._12_4_ = fVar217 * fStack_39c + fVar245 * fStack_38c;
                          auVar252._0_4_ =
                               fVar200 * (float)local_3f8._0_4_ + fVar234 * (float)local_3d8._0_4_;
                          auVar252._4_4_ =
                               fVar215 * (float)local_3f8._4_4_ + fVar243 * (float)local_3d8._4_4_;
                          auVar252._8_4_ = fVar216 * fStack_3f0 + fVar244 * fStack_3d0;
                          auVar252._12_4_ = fVar217 * fStack_3ec + fVar245 * fStack_3cc;
                          auVar260._0_4_ =
                               fVar200 * (float)local_2e8._0_4_ + fVar234 * (float)local_3e8._0_4_;
                          auVar260._4_4_ =
                               fVar215 * (float)local_2e8._4_4_ + fVar243 * (float)local_3e8._4_4_;
                          auVar260._8_4_ = fVar216 * fStack_2e0 + fVar244 * fStack_3e0;
                          auVar260._12_4_ = fVar217 * fStack_2dc + fVar245 * fStack_3dc;
                          auVar232._0_4_ =
                               fVar200 * (float)local_3c8._0_4_ + fVar234 * (float)local_3b8._0_4_;
                          auVar232._4_4_ =
                               fVar215 * (float)local_3c8._4_4_ + fVar243 * (float)local_3b8._4_4_;
                          auVar232._8_4_ = fVar216 * fStack_3c0 + fVar244 * fStack_3b0;
                          auVar232._12_4_ = fVar217 * fStack_3bc + fVar245 * fStack_3ac;
                          auVar65 = vsubps_avx(auVar252,auVar241);
                          auVar85 = vsubps_avx(auVar260,auVar252);
                          auVar77 = vsubps_avx(auVar232,auVar260);
                          local_1b8 = vshufps_avx(auVar99,auVar99,0);
                          fVar217 = local_1b8._0_4_;
                          fVar234 = local_1b8._4_4_;
                          fVar243 = local_1b8._8_4_;
                          fVar244 = local_1b8._12_4_;
                          auVar86 = vshufps_avx(ZEXT416((uint)fVar186),ZEXT416((uint)fVar186),0);
                          fVar186 = auVar86._0_4_;
                          fVar200 = auVar86._4_4_;
                          fVar215 = auVar86._8_4_;
                          fVar216 = auVar86._12_4_;
                          auVar86 = vshufps_avx(auVar198,auVar198,0);
                          auVar157 = vshufps_avx(ZEXT416((uint)fVar184),ZEXT416((uint)fVar184),0);
                          auVar166 = vshufps_avx(ZEXT416((uint)fVar133),ZEXT416((uint)fVar133),0);
                          auVar182._0_4_ =
                               (fVar186 * (fVar186 * auVar65._0_4_ + fVar217 * auVar85._0_4_) +
                               fVar217 * (fVar186 * auVar85._0_4_ + fVar217 * auVar77._0_4_)) * 3.0;
                          auVar182._4_4_ =
                               (fVar200 * (fVar200 * auVar65._4_4_ + fVar234 * auVar85._4_4_) +
                               fVar234 * (fVar200 * auVar85._4_4_ + fVar234 * auVar77._4_4_)) * 3.0;
                          auVar182._8_4_ =
                               (fVar215 * (fVar215 * auVar65._8_4_ + fVar243 * auVar85._8_4_) +
                               fVar243 * (fVar215 * auVar85._8_4_ + fVar243 * auVar77._8_4_)) * 3.0;
                          auVar182._12_4_ =
                               (fVar216 * (fVar216 * auVar65._12_4_ + fVar244 * auVar85._12_4_) +
                               fVar244 * (fVar216 * auVar85._12_4_ + fVar244 * auVar77._12_4_)) *
                               3.0;
                          auVar65 = vshufps_avx(ZEXT416((uint)fVar171),ZEXT416((uint)fVar171),0);
                          auVar144._0_4_ =
                               auVar65._0_4_ * (float)local_2f8._0_4_ +
                               auVar166._0_4_ * (float)local_308._0_4_ +
                               auVar86._0_4_ * (float)local_328._0_4_ +
                               auVar157._0_4_ * (float)local_318._0_4_;
                          auVar144._4_4_ =
                               auVar65._4_4_ * (float)local_2f8._4_4_ +
                               auVar166._4_4_ * (float)local_308._4_4_ +
                               auVar86._4_4_ * (float)local_328._4_4_ +
                               auVar157._4_4_ * (float)local_318._4_4_;
                          auVar144._8_4_ =
                               auVar65._8_4_ * fStack_2f0 +
                               auVar166._8_4_ * fStack_300 +
                               auVar86._8_4_ * fStack_320 + auVar157._8_4_ * fStack_310;
                          auVar144._12_4_ =
                               auVar65._12_4_ * fStack_2ec +
                               auVar166._12_4_ * fStack_2fc +
                               auVar86._12_4_ * fStack_31c + auVar157._12_4_ * fStack_30c;
                          auVar86 = vshufps_avx(auVar182,auVar182,0xc9);
                          auVar167._0_4_ = auVar144._0_4_ * auVar86._0_4_;
                          auVar167._4_4_ = auVar144._4_4_ * auVar86._4_4_;
                          auVar167._8_4_ = auVar144._8_4_ * auVar86._8_4_;
                          auVar167._12_4_ = auVar144._12_4_ * auVar86._12_4_;
                          auVar86 = vshufps_avx(auVar144,auVar144,0xc9);
                          auVar145._0_4_ = auVar182._0_4_ * auVar86._0_4_;
                          auVar145._4_4_ = auVar182._4_4_ * auVar86._4_4_;
                          auVar145._8_4_ = auVar182._8_4_ * auVar86._8_4_;
                          auVar145._12_4_ = auVar182._12_4_ * auVar86._12_4_;
                          auVar86 = vsubps_avx(auVar145,auVar167);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x80) = fVar170;
                            uVar4 = vextractps_avx(auVar86,1);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar4;
                            uVar4 = vextractps_avx(auVar86,2);
                            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar4;
                            *(int *)(ray + k * 4 + 0xe0) = auVar86._0_4_;
                            *(float *)(ray + k * 4 + 0xf0) = fVar131;
                            *(float *)(ray + k * 4 + 0x100) = fVar132;
                            *(int *)(ray + k * 4 + 0x110) = (int)local_438;
                            *(uint *)(ray + k * 4 + 0x120) = uVar57;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                            goto LAB_00f3ced8;
                          }
                          auVar157 = vshufps_avx(auVar86,auVar86,0x55);
                          local_1d8 = vshufps_avx(auVar86,auVar86,0xaa);
                          local_1c8 = vshufps_avx(auVar86,auVar86,0);
                          local_1e8[0] = (RTCHitN)auVar157[0];
                          local_1e8[1] = (RTCHitN)auVar157[1];
                          local_1e8[2] = (RTCHitN)auVar157[2];
                          local_1e8[3] = (RTCHitN)auVar157[3];
                          local_1e8[4] = (RTCHitN)auVar157[4];
                          local_1e8[5] = (RTCHitN)auVar157[5];
                          local_1e8[6] = (RTCHitN)auVar157[6];
                          local_1e8[7] = (RTCHitN)auVar157[7];
                          local_1e8[8] = (RTCHitN)auVar157[8];
                          local_1e8[9] = (RTCHitN)auVar157[9];
                          local_1e8[10] = (RTCHitN)auVar157[10];
                          local_1e8[0xb] = (RTCHitN)auVar157[0xb];
                          local_1e8[0xc] = (RTCHitN)auVar157[0xc];
                          local_1e8[0xd] = (RTCHitN)auVar157[0xd];
                          local_1e8[0xe] = (RTCHitN)auVar157[0xe];
                          local_1e8[0xf] = (RTCHitN)auVar157[0xf];
                          local_198 = local_358._0_8_;
                          uStack_190 = local_358._8_8_;
                          local_188 = local_348._0_8_;
                          uStack_180 = local_348._8_8_;
                          vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                          uStack_174 = context->user->instID[0];
                          local_178 = uStack_174;
                          uStack_170 = uStack_174;
                          uStack_16c = uStack_174;
                          uStack_168 = context->user->instPrimID[0];
                          uStack_164 = uStack_168;
                          uStack_160 = uStack_168;
                          uStack_15c = uStack_168;
                          *(float *)(ray + k * 4 + 0x80) = fVar170;
                          local_458 = *local_440;
                          uStack_450 = local_440[1];
                          local_428.valid = (int *)&local_458;
                          local_428.geometryUserPtr = pGVar7->userPtr;
                          local_428.context = context->user;
                          local_428.hit = local_1e8;
                          local_428.N = 4;
                          local_428.ray = (RTCRayN *)ray;
                          if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar7->intersectionFilterN)(&local_428);
                          }
                          auVar53._8_8_ = uStack_450;
                          auVar53._0_8_ = local_458;
                          if (auVar53 == (undefined1  [16])0x0) {
                            auVar298 = ZEXT1664(ZEXT816(0));
                            auVar86 = vpcmpeqd_avx(ZEXT816(0),(undefined1  [16])0x0);
                            auVar86 = auVar86 ^ _DAT_01febe20;
                          }
                          else {
                            p_Var10 = context->args->filter;
                            auVar298 = ZEXT1664(ZEXT816(0));
                            auVar86 = vpcmpeqd_avx(auVar53,auVar53);
                            if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar298._0_8_ = (*p_Var10)(&local_428);
                              auVar298._8_56_ = extraout_var;
                              auVar86 = vpcmpeqd_avx(auVar298._0_16_,auVar298._0_16_);
                              auVar298 = ZEXT1664(ZEXT816(0) << 0x40);
                            }
                            auVar54._8_8_ = uStack_450;
                            auVar54._0_8_ = local_458;
                            auVar157 = vpcmpeqd_avx(auVar298._0_16_,auVar54);
                            auVar86 = auVar157 ^ auVar86;
                            auVar166 = vpcmpeqd_avx(auVar54,auVar54);
                            if (auVar54 != (undefined1  [16])0x0) {
                              auVar157 = auVar157 ^ auVar166;
                              auVar166 = vmaskmovps_avx(auVar157,*(undefined1 (*) [16])local_428.hit
                                                       );
                              *(undefined1 (*) [16])(local_428.ray + 0xc0) = auVar166;
                              auVar166 = vmaskmovps_avx(auVar157,*(undefined1 (*) [16])
                                                                  (local_428.hit + 0x10));
                              *(undefined1 (*) [16])(local_428.ray + 0xd0) = auVar166;
                              auVar166 = vmaskmovps_avx(auVar157,*(undefined1 (*) [16])
                                                                  (local_428.hit + 0x20));
                              *(undefined1 (*) [16])(local_428.ray + 0xe0) = auVar166;
                              auVar166 = vmaskmovps_avx(auVar157,*(undefined1 (*) [16])
                                                                  (local_428.hit + 0x30));
                              *(undefined1 (*) [16])(local_428.ray + 0xf0) = auVar166;
                              auVar166 = vmaskmovps_avx(auVar157,*(undefined1 (*) [16])
                                                                  (local_428.hit + 0x40));
                              *(undefined1 (*) [16])(local_428.ray + 0x100) = auVar166;
                              auVar166 = vmaskmovps_avx(auVar157,*(undefined1 (*) [16])
                                                                  (local_428.hit + 0x50));
                              *(undefined1 (*) [16])(local_428.ray + 0x110) = auVar166;
                              auVar166 = vmaskmovps_avx(auVar157,*(undefined1 (*) [16])
                                                                  (local_428.hit + 0x60));
                              *(undefined1 (*) [16])(local_428.ray + 0x120) = auVar166;
                              auVar166 = vmaskmovps_avx(auVar157,*(undefined1 (*) [16])
                                                                  (local_428.hit + 0x70));
                              *(undefined1 (*) [16])(local_428.ray + 0x130) = auVar166;
                              auVar157 = vmaskmovps_avx(auVar157,*(undefined1 (*) [16])
                                                                  (local_428.hit + 0x80));
                              *(undefined1 (*) [16])(local_428.ray + 0x140) = auVar157;
                            }
                          }
                          auVar95._8_8_ = 0x100000001;
                          auVar95._0_8_ = 0x100000001;
                          if ((auVar95 & auVar86) == (undefined1  [16])0x0) {
                            *(float *)(ray + k * 4 + 0x80) = fVar185;
                          }
                        }
                      }
                    }
                    break;
                  }
                  lVar59 = lVar59 + -1;
                } while (lVar59 != 0);
              }
              goto LAB_00f3cef5;
            }
          }
          goto LAB_00f3cf08;
        }
      }
LAB_00f3cef5:
    } while (bVar50);
    local_538 = ZEXT416((uint)fVar169);
    auVar86 = vinsertps_avx(local_538,ZEXT416((uint)fVar168),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_hn(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }